

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian_misc.cpp
# Opt level: O0

void __thiscall
amrex::MLNodeLaplacian::updateVelocity
          (MLNodeLaplacian *this,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *vel,
          Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *sol)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  Geometry *this_00;
  pointer pFVar4;
  FabArray<amrex::FArrayBox> *this_01;
  MultiFab **ppMVar5;
  long lVar6;
  FabArrayBase *in_RDI;
  int i_3;
  int j_3;
  int k_3;
  Dim3 amrex_i_hi_3;
  Dim3 amrex_i_lo_3;
  Real const_sigma;
  int i_2;
  int j_2;
  int k_2;
  Dim3 amrex_i_hi_2;
  Dim3 amrex_i_lo_2;
  Array4<const_double> *sigmaarr_1;
  int i_1;
  int j_1;
  int k_1;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<const_double> *intgarr;
  Array4<const_double> *vfracarr;
  FabType type;
  Array4<const_double> *sigmaarr;
  bool regular;
  Array4<const_double> *solarr;
  Array4<double> *varr;
  Box *bx;
  MFIter mfi;
  MultiFab *intg;
  MultiFab *vfrac;
  FabArray<amrex::EBCellFlagFab> *flags;
  EBFArrayBoxFactory *factory;
  GpuArray<double,_3U> dxinv;
  value_type *sigma;
  int amrlev;
  Real dpp_xyz;
  Real dpp_yz;
  Real dpp_xz;
  Real dpp_xy;
  Real dpdz;
  Real dpdy;
  Real dpdx;
  Real facz;
  Real facy;
  Real facx;
  Real facz_1;
  Real facy_1;
  Real facx_1;
  MFIter *in_stack_ffffffffffffeaa8;
  FabArray<amrex::EBCellFlagFab> *in_stack_ffffffffffffeab0;
  FabArray<amrex::EBCellFlagFab> *local_1540;
  long local_1538;
  undefined1 do_tiling_;
  undefined4 in_stack_ffffffffffffeae0;
  int in_stack_ffffffffffffeae4;
  int local_1518;
  int local_1514;
  MFIter *in_stack_ffffffffffffeb10;
  int local_14c4;
  int local_14c0;
  int local_14bc;
  MFIter *local_1438;
  undefined4 in_stack_ffffffffffffebd0;
  int in_stack_ffffffffffffebd4;
  int in_stack_ffffffffffffebd8;
  int iVar7;
  int in_stack_ffffffffffffebdc;
  int local_13e0;
  int local_13dc;
  int local_13d8;
  int local_13d4;
  long local_1390;
  long local_1388;
  long local_1380;
  long local_1378;
  int local_1370;
  int local_136c;
  int local_1368;
  long *local_1350;
  long local_1348 [8];
  long *local_1308;
  FabType local_12fc;
  long local_12f8 [8];
  long *local_12b8;
  byte local_12a9;
  long local_12a8 [8];
  long *local_1268;
  long local_1260 [8];
  long *local_1220;
  int local_1214 [7];
  int *local_11f8;
  MFIter local_11f0;
  pointer local_1190;
  FabArray<amrex::FArrayBox> *local_1188;
  FabArray<amrex::EBCellFlagFab> *local_1180;
  long local_1178;
  GpuArray<double,_3U> local_1170;
  const_reference local_1158;
  int local_114c;
  MFIter *local_1130;
  int local_1128;
  int *local_1120;
  int local_1114;
  int iStack_1110;
  int local_110c;
  undefined8 local_1108;
  int local_1100;
  int *local_10f8;
  int local_10ec;
  int iStack_10e8;
  int local_10e4;
  undefined8 local_10e0;
  int local_10d8;
  int *local_10d0;
  int local_10c4;
  int iStack_10c0;
  int local_10bc;
  undefined8 local_10b8;
  int local_10b0;
  int *local_10a8;
  int local_109c;
  int iStack_1098;
  int local_1094;
  undefined8 local_1090;
  int local_1088;
  int *local_1080;
  int local_1074;
  int iStack_1070;
  int local_106c;
  undefined8 local_1068;
  int local_1060;
  int *local_1058;
  int local_104c;
  int iStack_1048;
  int local_1044;
  undefined8 local_1040;
  int local_1038;
  int *local_1030;
  int local_1024;
  int iStack_1020;
  int local_101c;
  undefined8 local_1018;
  int local_1010;
  int *local_1008;
  int local_ffc;
  int iStack_ff8;
  int local_ff4;
  int local_ff0;
  int local_fec;
  int local_fe8;
  int local_fe4;
  long *local_fe0;
  double local_fd8;
  double local_fd0;
  double local_fc8;
  double local_fc0;
  double local_fb8;
  double local_fb0;
  double local_fa8;
  GpuArray<double,_3U> *local_fa0;
  long *local_f98;
  long *local_f90;
  long *local_f88;
  long *local_f80;
  long *local_f78;
  int local_f6c;
  int local_f68;
  int local_f64;
  undefined4 local_f60;
  int local_f5c;
  int local_f58;
  int local_f54;
  long *local_f50;
  undefined4 local_f48;
  int local_f44;
  int local_f40;
  int local_f3c;
  long *local_f38;
  undefined4 local_f30;
  int local_f2c;
  int local_f28;
  int local_f24;
  long *local_f20;
  undefined4 local_f18;
  int local_f14;
  int local_f10;
  int local_f0c;
  long *local_f08;
  undefined4 local_f00;
  int local_efc;
  int local_ef8;
  int local_ef4;
  long *local_ef0;
  undefined4 local_ee8;
  int local_ee4;
  int local_ee0;
  int local_edc;
  long *local_ed8;
  double local_ed0;
  double local_ec8;
  double local_ec0;
  GpuArray<double,_3U> *local_eb8;
  MFIter *local_eb0;
  long *local_ea8;
  long *local_ea0;
  int local_e94;
  int local_e90;
  int local_e8c;
  undefined4 local_e88;
  int local_e84;
  int local_e80;
  int local_e7c;
  long *local_e78;
  undefined4 local_e70;
  int local_e6c;
  int local_e68;
  int local_e64;
  long *local_e60;
  undefined4 local_e58;
  int local_e54;
  int local_e50;
  int local_e4c;
  long *local_e48;
  double local_e40;
  double local_e38;
  double local_e30;
  GpuArray<double,_3U> *local_e28;
  double local_e20;
  long *local_e18;
  long *local_e10;
  int local_e04;
  int local_e00;
  int local_dfc;
  undefined4 local_df8;
  int local_df4;
  int local_df0;
  int local_dec;
  long *local_de8;
  undefined4 local_de0;
  int local_ddc;
  int local_dd8;
  int local_dd4;
  long *local_dd0;
  undefined4 local_dc8;
  int local_dc4;
  int local_dc0;
  int local_dbc;
  long *local_db8;
  undefined4 local_dac;
  int *local_da8;
  undefined4 local_d9c;
  int *local_d98;
  undefined4 local_d8c;
  int *local_d88;
  undefined4 local_d7c;
  int *local_d78;
  undefined4 local_d6c;
  int *local_d68;
  undefined4 local_d5c;
  int *local_d58;
  undefined4 local_d4c;
  int *local_d48;
  undefined4 local_d3c;
  int *local_d38;
  undefined4 local_d2c;
  int *local_d28;
  undefined4 local_d1c;
  int *local_d18;
  undefined4 local_d0c;
  int *local_d08;
  undefined4 local_cfc;
  int *local_cf8;
  undefined4 local_cec;
  int *local_ce8;
  undefined4 local_cdc;
  int *local_cd8;
  undefined4 local_ccc;
  int *local_cc8;
  undefined4 local_cbc;
  int *local_cb8;
  undefined4 local_cac;
  int *local_ca8;
  undefined4 local_c9c;
  int *local_c98;
  undefined4 local_c8c;
  int *local_c88;
  undefined4 local_c7c;
  int *local_c78;
  undefined4 local_c6c;
  int *local_c68;
  undefined4 local_c5c;
  int *local_c58;
  undefined4 local_c4c;
  int *local_c48;
  undefined4 local_c3c;
  int *local_c38;
  int local_c2c;
  int local_c28;
  int local_c24;
  long *local_c20;
  int local_c14;
  int local_c10;
  int local_c0c;
  long *local_c08;
  int local_bfc;
  int local_bf8;
  int local_bf4;
  long *local_bf0;
  int local_be4;
  int local_be0;
  int local_bdc;
  long *local_bd8;
  int local_bcc;
  int local_bc8;
  int local_bc4;
  long *local_bc0;
  int local_bb4;
  int local_bb0;
  int local_bac;
  long *local_ba8;
  int local_b9c;
  int local_b98;
  int local_b94;
  long *local_b90;
  int local_b84;
  int local_b80;
  int local_b7c;
  long *local_b78;
  int local_b6c;
  int local_b68;
  int local_b64;
  long *local_b60;
  int local_b54;
  int local_b50;
  int local_b4c;
  long *local_b48;
  int local_b3c;
  int local_b38;
  int local_b34;
  long *local_b30;
  int local_b24;
  int local_b20;
  int local_b1c;
  long *local_b18;
  int local_b0c;
  int local_b08;
  int local_b04;
  long *local_b00;
  int local_af4;
  int local_af0;
  int local_aec;
  long *local_ae8;
  int local_adc;
  int local_ad8;
  int local_ad4;
  long *local_ad0;
  int local_ac4;
  int local_ac0;
  int local_abc;
  long *local_ab8;
  int local_aac;
  int local_aa8;
  int local_aa4;
  long *local_aa0;
  int local_a94;
  int local_a90;
  int local_a8c;
  long *local_a88;
  int local_a7c;
  int local_a78;
  int local_a74;
  long *local_a70;
  int local_a64;
  int local_a60;
  int local_a5c;
  long *local_a58;
  int local_a4c;
  int local_a48;
  int local_a44;
  long *local_a40;
  int local_a34;
  int local_a30;
  int local_a2c;
  long *local_a28;
  int local_a1c;
  int local_a18;
  int local_a14;
  long *local_a10;
  int local_a04;
  int local_a00;
  int local_9fc;
  long *local_9f8;
  int local_9ec;
  int local_9e8;
  int local_9e4;
  long *local_9e0;
  int local_9d4;
  int local_9d0;
  int local_9cc;
  long *local_9c8;
  int local_9bc;
  int local_9b8;
  int local_9b4;
  long *local_9b0;
  int local_9a4;
  int local_9a0;
  int local_99c;
  long *local_998;
  int local_98c;
  int local_988;
  int local_984;
  long *local_980;
  int local_974;
  int local_970;
  int local_96c;
  long *local_968;
  int local_95c;
  int local_958;
  int local_954;
  long *local_950;
  int local_944;
  int local_940;
  int local_93c;
  long *local_938;
  int local_92c;
  int local_928;
  int local_924;
  MFIter *local_920;
  int local_914;
  int local_910;
  int local_90c;
  long *local_908;
  int local_8fc;
  int local_8f8;
  int local_8f4;
  long *local_8f0;
  int local_8e4;
  int local_8e0;
  int local_8dc;
  long *local_8d8;
  int local_8cc;
  int local_8c8;
  int local_8c4;
  long *local_8c0;
  int local_8b4;
  int local_8b0;
  int local_8ac;
  long *local_8a8;
  int local_89c;
  int local_898;
  int local_894;
  long *local_890;
  int local_884;
  int local_880;
  int local_87c;
  long *local_878;
  int local_86c;
  int local_868;
  int local_864;
  long *local_860;
  int local_854;
  int local_850;
  int local_84c;
  MFIter *local_848;
  int local_83c;
  int local_838;
  int local_834;
  long *local_830;
  int local_824;
  int local_820;
  int local_81c;
  long *local_818;
  int local_80c;
  int local_808;
  int local_804;
  long *local_800;
  int local_7f4;
  int local_7f0;
  int local_7ec;
  long *local_7e8;
  int local_7dc;
  int local_7d8;
  int local_7d4;
  long *local_7d0;
  int local_7c4;
  int local_7c0;
  int local_7bc;
  long *local_7b8;
  int local_7ac;
  int local_7a8;
  int local_7a4;
  long *local_7a0;
  int local_794;
  int local_790;
  int local_78c;
  long *local_788;
  int local_77c;
  int local_778;
  int local_774;
  MFIter *local_770;
  int local_764;
  int local_760;
  int local_75c;
  long *local_758;
  int local_74c;
  int local_748;
  int local_744;
  long *local_740;
  int local_734;
  int local_730;
  int local_72c;
  long *local_728;
  int local_71c;
  int local_718;
  int local_714;
  long *local_710;
  int local_704;
  int local_700;
  int local_6fc;
  long *local_6f8;
  int local_6ec;
  int local_6e8;
  int local_6e4;
  long *local_6e0;
  int local_6d4;
  int local_6d0;
  int local_6cc;
  long *local_6c8;
  int local_6bc;
  int local_6b8;
  int local_6b4;
  long *local_6b0;
  int local_6a4;
  int local_6a0;
  int local_69c;
  long *local_698;
  int local_68c;
  int local_688;
  int local_684;
  long *local_680;
  int local_674;
  int local_670;
  int local_66c;
  long *local_668;
  int local_65c;
  int local_658;
  int local_654;
  long *local_650;
  int local_644;
  int local_640;
  int local_63c;
  long *local_638;
  int local_62c;
  int local_628;
  int local_624;
  long *local_620;
  int local_614;
  int local_610;
  int local_60c;
  long *local_608;
  int local_5fc;
  int local_5f8;
  int local_5f4;
  long *local_5f0;
  int local_5e4;
  int local_5e0;
  int local_5dc;
  long *local_5d8;
  int local_5cc;
  int local_5c8;
  int local_5c4;
  long *local_5c0;
  int local_5b4;
  int local_5b0;
  int local_5ac;
  long *local_5a8;
  int local_59c;
  int local_598;
  int local_594;
  long *local_590;
  int local_584;
  int local_580;
  int local_57c;
  long *local_578;
  int local_56c;
  int local_568;
  int local_564;
  long *local_560;
  int local_554;
  int local_550;
  int local_54c;
  long *local_548;
  int local_53c;
  int local_538;
  int local_534;
  long *local_530;
  int local_524;
  int local_520;
  int local_51c;
  long *local_518;
  int local_50c;
  int local_508;
  int local_504;
  long *local_500;
  int local_4f4;
  int local_4f0;
  int local_4ec;
  long *local_4e8;
  int local_4dc;
  int local_4d8;
  int local_4d4;
  long *local_4d0;
  int local_4c4;
  int local_4c0;
  int local_4bc;
  long *local_4b8;
  int local_4ac;
  int local_4a8;
  int local_4a4;
  long *local_4a0;
  int local_494;
  int local_490;
  int local_48c;
  long *local_488;
  int local_47c;
  int local_478;
  int local_474;
  long *local_470;
  int local_464;
  int local_460;
  int local_45c;
  long *local_458;
  int local_44c;
  int local_448;
  int local_444;
  long *local_440;
  int local_434;
  int local_430;
  int local_42c;
  long *local_428;
  int local_41c;
  int local_418;
  int local_414;
  long *local_410;
  int local_404;
  int local_400;
  int local_3fc;
  long *local_3f8;
  int local_3ec;
  int local_3e8;
  int local_3e4;
  long *local_3e0;
  int local_3d4;
  int local_3d0;
  int local_3cc;
  long *local_3c8;
  int local_3bc;
  int local_3b8;
  int local_3b4;
  long *local_3b0;
  int local_3a4;
  int local_3a0;
  int local_39c;
  long *local_398;
  int local_38c;
  int local_388;
  int local_384;
  long *local_380;
  int local_374;
  int local_370;
  int local_36c;
  long *local_368;
  int local_35c;
  int local_358;
  int local_354;
  long *local_350;
  int local_344;
  int local_340;
  int local_33c;
  long *local_338;
  int local_32c;
  int local_328;
  int local_324;
  long *local_320;
  int local_314;
  int local_310;
  int local_30c;
  long *local_308;
  int local_2fc;
  int local_2f8;
  int local_2f4;
  long *local_2f0;
  int local_2e4;
  int local_2e0;
  int local_2dc;
  long *local_2d8;
  int local_2cc;
  int local_2c8;
  int local_2c4;
  long *local_2c0;
  int local_2b4;
  int local_2b0;
  int local_2ac;
  long *local_2a8;
  int local_29c;
  int local_298;
  int local_294;
  long *local_290;
  int local_284;
  int local_280;
  int local_27c;
  long *local_278;
  int local_26c;
  int local_268;
  int local_264;
  long *local_260;
  int local_254;
  int local_250;
  int local_24c;
  long *local_248;
  int local_23c;
  int local_238;
  int local_234;
  long *local_230;
  int local_224;
  int local_220;
  int local_21c;
  long *local_218;
  int local_20c;
  int local_208;
  int local_204;
  long *local_200;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  long *local_1e8;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  long *local_1d0;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  long *local_1b8;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  long *local_1a0;
  int local_194;
  int local_190;
  int local_18c;
  long *local_188;
  int local_17c;
  int local_178;
  int local_174;
  long *local_170;
  undefined4 local_168;
  int local_164;
  int local_160;
  int local_15c;
  long *local_158;
  undefined4 local_150;
  int local_14c;
  int local_148;
  int local_144;
  long *local_140;
  undefined4 local_138;
  int local_134;
  int local_130;
  int local_12c;
  long *local_128;
  undefined4 local_120;
  int local_11c;
  int local_118;
  int local_114;
  long *local_110;
  undefined4 local_108;
  int local_104;
  int local_100;
  int local_fc;
  long *local_f8;
  undefined4 local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  long *local_e0;
  undefined4 local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  long *local_c8;
  undefined4 local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  long *local_b0;
  undefined4 local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  long *local_98;
  undefined4 local_8c;
  GpuArray<double,_3U> *local_88;
  undefined4 local_7c;
  GpuArray<double,_3U> *local_78;
  undefined4 local_6c;
  GpuArray<double,_3U> *local_68;
  undefined4 local_5c;
  GpuArray<double,_3U> *local_58;
  undefined4 local_4c;
  GpuArray<double,_3U> *local_48;
  undefined4 local_3c;
  GpuArray<double,_3U> *local_38;
  undefined4 local_2c;
  GpuArray<double,_3U> *local_28;
  undefined4 local_1c;
  GpuArray<double,_3U> *local_18;
  undefined4 local_c;
  GpuArray<double,_3U> *local_8;
  
  for (local_114c = 0; local_114c < (in_RDI->boxarray).m_bat.m_op.m_bndryReg.m_hishft.vect[2];
      local_114c = local_114c + 1) {
    Vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
    ::operator[]((Vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                  *)in_stack_ffffffffffffeab0,(size_type)in_stack_ffffffffffffeaa8);
    Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
    ::operator[]((Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                  *)in_stack_ffffffffffffeab0,(size_type)in_stack_ffffffffffffeaa8);
    local_1158 = std::
                 array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>
                 ::operator[]((array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>
                               *)in_stack_ffffffffffffeab0,(size_type)in_stack_ffffffffffffeaa8);
    Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                  *)in_stack_ffffffffffffeab0,(size_type)in_stack_ffffffffffffeaa8);
    this_00 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                        ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                         in_stack_ffffffffffffeab0,(size_type)in_stack_ffffffffffffeaa8);
    CoordSys::InvCellSizeArray(&local_1170,&this_00->super_CoordSys);
    Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
    ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffeab0,(size_type)in_stack_ffffffffffffeaa8);
    Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                  *)in_stack_ffffffffffffeab0,(size_type)in_stack_ffffffffffffeaa8);
    pFVar4 = std::
             unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ::get((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                    *)in_stack_ffffffffffffeab0);
    if (pFVar4 == (pointer)0x0) {
      local_1538 = 0;
    }
    else {
      local_1538 = __dynamic_cast(pFVar4,&FabFactory<amrex::FArrayBox>::typeinfo,
                                  &EBFArrayBoxFactory::typeinfo,0);
    }
    do_tiling_ = (undefined1)((ulong)pFVar4 >> 0x38);
    local_1178 = local_1538;
    if (local_1538 == 0) {
      local_1540 = (FabArray<amrex::EBCellFlagFab> *)0x0;
    }
    else {
      local_1540 = EBFArrayBoxFactory::getMultiEBCellFlagFab
                             ((EBFArrayBoxFactory *)in_stack_ffffffffffffeab0);
    }
    local_1180 = local_1540;
    if (local_1178 == 0) {
      this_01 = (FabArray<amrex::FArrayBox> *)0x0;
    }
    else {
      this_01 = &EBFArrayBoxFactory::getVolFrac((EBFArrayBoxFactory *)in_stack_ffffffffffffeab0)->
                 super_FabArray<amrex::FArrayBox>;
    }
    local_1188 = this_01;
    Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  *)in_stack_ffffffffffffeab0,(size_type)in_stack_ffffffffffffeaa8);
    local_1190 = std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::get
                           ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                            in_stack_ffffffffffffeab0);
    ppMVar5 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                        ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                         in_stack_ffffffffffffeab0,(size_type)in_stack_ffffffffffffeaa8);
    in_stack_ffffffffffffeab0 = (FabArray<amrex::EBCellFlagFab> *)*ppMVar5;
    TilingIfNotGPU();
    MFIter::MFIter((MFIter *)CONCAT44(in_stack_ffffffffffffeae4,in_stack_ffffffffffffeae0),in_RDI,
                   (bool)do_tiling_);
    while (bVar3 = MFIter::isValid(&local_11f0), bVar3) {
      MFIter::tilebox(in_stack_ffffffffffffeb10);
      local_11f8 = local_1214;
      Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                 in_stack_ffffffffffffeab0,(size_type)in_stack_ffffffffffffeaa8);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (this_01,(MFIter *)in_stack_ffffffffffffeab0);
      local_1220 = local_1260;
      Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::operator[]
                ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                 in_stack_ffffffffffffeab0,(size_type)in_stack_ffffffffffffeaa8);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (this_01,(MFIter *)in_stack_ffffffffffffeab0);
      local_1268 = local_12a8;
      local_12a9 = (local_1178 != 0 ^ 0xffU) & 1;
      if (local_1178 != 0) {
        std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                  ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x172f29d);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (this_01,(MFIter *)in_stack_ffffffffffffeab0);
        local_12b8 = local_12f8;
        FabArray<amrex::EBCellFlagFab>::operator[]
                  (in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8);
        local_12fc = EBCellFlagFab::getType
                               ((EBCellFlagFab *)
                                CONCAT44(in_stack_ffffffffffffebdc,in_stack_ffffffffffffebd8),
                                (Box *)CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0)
                               );
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (this_01,(MFIter *)in_stack_ffffffffffffeab0);
        local_1308 = local_1348;
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (this_01,(MFIter *)in_stack_ffffffffffffeab0);
        local_1350 = &local_1390;
        if (local_12fc == covered) {
          local_10a8 = local_11f8;
          local_cc8 = local_11f8;
          local_ccc = 0;
          local_109c = *local_11f8;
          local_cd8 = local_11f8;
          local_cdc = 1;
          iStack_1098 = local_11f8[1];
          local_10b8 = *(undefined8 *)local_11f8;
          local_ce8 = local_11f8;
          local_cec = 2;
          local_10b0 = local_11f8[2];
          local_1008 = local_11f8;
          local_d88 = local_11f8 + 3;
          local_d8c = 0;
          local_ffc = *local_d88;
          local_d98 = local_11f8 + 3;
          local_d9c = 1;
          iStack_ff8 = local_11f8[4];
          local_1018 = *(undefined8 *)local_d88;
          local_da8 = local_11f8 + 3;
          local_dac = 2;
          local_1010 = local_11f8[5];
          for (local_13d4 = 0; local_13d8 = local_10b0, local_1094 = local_10b0,
              local_ff4 = local_1010, local_13d4 < 3; local_13d4 = local_13d4 + 1) {
            for (; local_13dc = iStack_1098, local_13d8 <= local_1010; local_13d8 = local_13d8 + 1)
            {
              for (; local_13e0 = local_109c, local_13dc <= iStack_ff8; local_13dc = local_13dc + 1)
              {
                for (; local_13e0 <= local_ffc; local_13e0 = local_13e0 + 1) {
                  local_fe0 = local_1220;
                  local_fe4 = local_13e0;
                  local_fe8 = local_13dc;
                  local_fec = local_13d8;
                  local_ff0 = local_13d4;
                  *(undefined8 *)
                   (*local_1220 +
                   ((long)(local_13e0 - (int)local_1220[4]) +
                    (long)(local_13dc - *(int *)((long)local_1220 + 0x24)) * local_1220[1] +
                    (long)(local_13d8 - (int)local_1220[5]) * local_1220[2] +
                   (long)local_13d4 * local_1220[3]) * 8) = 0;
                }
              }
            }
          }
        }
        else if (local_12fc == singlevalued) {
          local_10d0 = local_11f8;
          local_c98 = local_11f8;
          local_c9c = 0;
          local_10c4 = *local_11f8;
          local_ca8 = local_11f8;
          local_cac = 1;
          iStack_10c0 = local_11f8[1];
          local_10e0 = *(undefined8 *)local_11f8;
          local_cb8 = local_11f8;
          local_cbc = 2;
          local_10d8 = local_11f8[2];
          local_1030 = local_11f8;
          local_d58 = local_11f8 + 3;
          local_d5c = 0;
          local_1024 = *local_d58;
          local_d68 = local_11f8 + 3;
          local_d6c = 1;
          iStack_1020 = local_11f8[4];
          local_1040 = *(undefined8 *)local_d58;
          local_d78 = local_11f8 + 3;
          local_d7c = 2;
          local_1038 = local_11f8[5];
          for (in_stack_ffffffffffffebdc = local_10d8; iVar7 = iStack_10c0, local_10bc = local_10d8,
              local_101c = local_1038, in_stack_ffffffffffffebdc <= local_1038;
              in_stack_ffffffffffffebdc = in_stack_ffffffffffffebdc + 1) {
            for (; iVar2 = local_10c4, iVar7 <= iStack_1020; iVar7 = iVar7 + 1) {
              while (in_stack_ffffffffffffebd4 = iVar2, in_stack_ffffffffffffebd4 <= local_1024) {
                local_f78 = local_1220;
                local_f80 = local_1268;
                local_f88 = local_12b8;
                local_f90 = local_1308;
                local_fa0 = &local_1170;
                local_170 = local_1308;
                dVar1 = *(double *)
                         (*local_1308 +
                         ((long)(in_stack_ffffffffffffebd4 - (int)local_1308[4]) +
                          (long)(iVar7 - *(int *)((long)local_1308 + 0x24)) * local_1308[1] +
                         (long)(in_stack_ffffffffffffebdc - (int)local_1308[5]) * local_1308[2]) * 8
                         );
                if ((dVar1 != 0.0) || (NAN(dVar1))) {
                  local_188 = local_1268;
                  local_1a4 = in_stack_ffffffffffffebd4 + 1;
                  local_1a0 = local_1268;
                  local_1c0 = iVar7 + 1;
                  local_1b8 = local_1268;
                  local_1d4 = in_stack_ffffffffffffebd4 + 1;
                  local_1d8 = iVar7 + 1;
                  local_1d0 = local_1268;
                  local_1f4 = in_stack_ffffffffffffebdc + 1;
                  local_1e8 = local_1268;
                  local_204 = in_stack_ffffffffffffebd4 + 1;
                  local_20c = in_stack_ffffffffffffebdc + 1;
                  local_200 = local_1268;
                  local_220 = iVar7 + 1;
                  local_224 = in_stack_ffffffffffffebdc + 1;
                  local_218 = local_1268;
                  local_234 = in_stack_ffffffffffffebd4 + 1;
                  local_238 = iVar7 + 1;
                  local_23c = in_stack_ffffffffffffebdc + 1;
                  local_230 = local_1268;
                  local_fa8 = (((((((-*(double *)
                                       (*local_1268 +
                                       ((long)(in_stack_ffffffffffffebd4 - (int)local_1268[4]) +
                                        (long)(iVar7 - *(int *)((long)local_1268 + 0x24)) *
                                        local_1268[1] +
                                       (long)(in_stack_ffffffffffffebdc - (int)local_1268[5]) *
                                       local_1268[2]) * 8) +
                                    *(double *)
                                     (*local_1268 +
                                     ((long)(local_1a4 - (int)local_1268[4]) +
                                      (long)(iVar7 - *(int *)((long)local_1268 + 0x24)) *
                                      local_1268[1] +
                                     (long)(in_stack_ffffffffffffebdc - (int)local_1268[5]) *
                                     local_1268[2]) * 8)) -
                                   *(double *)
                                    (*local_1268 +
                                    ((long)(in_stack_ffffffffffffebd4 - (int)local_1268[4]) +
                                     (long)(local_1c0 - *(int *)((long)local_1268 + 0x24)) *
                                     local_1268[1] +
                                    (long)(in_stack_ffffffffffffebdc - (int)local_1268[5]) *
                                    local_1268[2]) * 8)) +
                                  *(double *)
                                   (*local_1268 +
                                   ((long)(local_1d4 - (int)local_1268[4]) +
                                    (long)(local_1d8 - *(int *)((long)local_1268 + 0x24)) *
                                    local_1268[1] +
                                   (long)(in_stack_ffffffffffffebdc - (int)local_1268[5]) *
                                   local_1268[2]) * 8)) -
                                 *(double *)
                                  (*local_1268 +
                                  ((long)(in_stack_ffffffffffffebd4 - (int)local_1268[4]) +
                                   (long)(iVar7 - *(int *)((long)local_1268 + 0x24)) * local_1268[1]
                                  + (long)(local_1f4 - (int)local_1268[5]) * local_1268[2]) * 8)) +
                                *(double *)
                                 (*local_1268 +
                                 ((long)(local_204 - (int)local_1268[4]) +
                                  (long)(iVar7 - *(int *)((long)local_1268 + 0x24)) * local_1268[1]
                                 + (long)(local_20c - (int)local_1268[5]) * local_1268[2]) * 8)) -
                               *(double *)
                                (*local_1268 +
                                ((long)(in_stack_ffffffffffffebd4 - (int)local_1268[4]) +
                                 (long)(local_220 - *(int *)((long)local_1268 + 0x24)) *
                                 local_1268[1] +
                                (long)(local_224 - (int)local_1268[5]) * local_1268[2]) * 8)) +
                              *(double *)
                               (*local_1268 +
                               ((long)(local_234 - (int)local_1268[4]) +
                                (long)(local_238 - *(int *)((long)local_1268 + 0x24)) *
                                local_1268[1] +
                               (long)(local_23c - (int)local_1268[5]) * local_1268[2]) * 8)) * 0.25;
                  local_248 = local_1268;
                  local_264 = in_stack_ffffffffffffebd4 + 1;
                  local_260 = local_1268;
                  local_280 = iVar7 + 1;
                  local_278 = local_1268;
                  local_294 = in_stack_ffffffffffffebd4 + 1;
                  local_298 = iVar7 + 1;
                  local_290 = local_1268;
                  local_2b4 = in_stack_ffffffffffffebdc + 1;
                  local_2a8 = local_1268;
                  local_2c4 = in_stack_ffffffffffffebd4 + 1;
                  local_2cc = in_stack_ffffffffffffebdc + 1;
                  local_2c0 = local_1268;
                  local_2e0 = iVar7 + 1;
                  local_2e4 = in_stack_ffffffffffffebdc + 1;
                  local_2d8 = local_1268;
                  local_2f4 = in_stack_ffffffffffffebd4 + 1;
                  local_2f8 = iVar7 + 1;
                  local_2fc = in_stack_ffffffffffffebdc + 1;
                  local_2f0 = local_1268;
                  local_fb0 = (((((-*(double *)
                                     (*local_1268 +
                                     ((long)(in_stack_ffffffffffffebd4 - (int)local_1268[4]) +
                                      (long)(iVar7 - *(int *)((long)local_1268 + 0x24)) *
                                      local_1268[1] +
                                     (long)(in_stack_ffffffffffffebdc - (int)local_1268[5]) *
                                     local_1268[2]) * 8) -
                                  *(double *)
                                   (*local_1268 +
                                   ((long)(local_264 - (int)local_1268[4]) +
                                    (long)(iVar7 - *(int *)((long)local_1268 + 0x24)) *
                                    local_1268[1] +
                                   (long)(in_stack_ffffffffffffebdc - (int)local_1268[5]) *
                                   local_1268[2]) * 8)) +
                                  *(double *)
                                   (*local_1268 +
                                   ((long)(in_stack_ffffffffffffebd4 - (int)local_1268[4]) +
                                    (long)(local_280 - *(int *)((long)local_1268 + 0x24)) *
                                    local_1268[1] +
                                   (long)(in_stack_ffffffffffffebdc - (int)local_1268[5]) *
                                   local_1268[2]) * 8) +
                                 *(double *)
                                  (*local_1268 +
                                  ((long)(local_294 - (int)local_1268[4]) +
                                   (long)(local_298 - *(int *)((long)local_1268 + 0x24)) *
                                   local_1268[1] +
                                  (long)(in_stack_ffffffffffffebdc - (int)local_1268[5]) *
                                  local_1268[2]) * 8)) -
                                *(double *)
                                 (*local_1268 +
                                 ((long)(in_stack_ffffffffffffebd4 - (int)local_1268[4]) +
                                  (long)(iVar7 - *(int *)((long)local_1268 + 0x24)) * local_1268[1]
                                 + (long)(local_2b4 - (int)local_1268[5]) * local_1268[2]) * 8)) -
                               *(double *)
                                (*local_1268 +
                                ((long)(local_2c4 - (int)local_1268[4]) +
                                 (long)(iVar7 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                                (long)(local_2cc - (int)local_1268[5]) * local_1268[2]) * 8)) +
                               *(double *)
                                (*local_1268 +
                                ((long)(in_stack_ffffffffffffebd4 - (int)local_1268[4]) +
                                 (long)(local_2e0 - *(int *)((long)local_1268 + 0x24)) *
                                 local_1268[1] +
                                (long)(local_2e4 - (int)local_1268[5]) * local_1268[2]) * 8) +
                              *(double *)
                               (*local_1268 +
                               ((long)(local_2f4 - (int)local_1268[4]) +
                                (long)(local_2f8 - *(int *)((long)local_1268 + 0x24)) *
                                local_1268[1] +
                               (long)(local_2fc - (int)local_1268[5]) * local_1268[2]) * 8)) * 0.25;
                  local_308 = local_1268;
                  local_324 = in_stack_ffffffffffffebd4 + 1;
                  local_320 = local_1268;
                  local_340 = iVar7 + 1;
                  local_338 = local_1268;
                  local_354 = in_stack_ffffffffffffebd4 + 1;
                  local_358 = iVar7 + 1;
                  local_350 = local_1268;
                  local_374 = in_stack_ffffffffffffebdc + 1;
                  local_368 = local_1268;
                  local_384 = in_stack_ffffffffffffebd4 + 1;
                  local_38c = in_stack_ffffffffffffebdc + 1;
                  local_380 = local_1268;
                  local_3a0 = iVar7 + 1;
                  local_3a4 = in_stack_ffffffffffffebdc + 1;
                  local_398 = local_1268;
                  local_3b4 = in_stack_ffffffffffffebd4 + 1;
                  local_3b8 = iVar7 + 1;
                  local_3bc = in_stack_ffffffffffffebdc + 1;
                  local_3b0 = local_1268;
                  local_fb8 = ((((-*(double *)
                                    (*local_1268 +
                                    ((long)(in_stack_ffffffffffffebd4 - (int)local_1268[4]) +
                                     (long)(iVar7 - *(int *)((long)local_1268 + 0x24)) *
                                     local_1268[1] +
                                    (long)(in_stack_ffffffffffffebdc - (int)local_1268[5]) *
                                    local_1268[2]) * 8) -
                                 *(double *)
                                  (*local_1268 +
                                  ((long)(local_324 - (int)local_1268[4]) +
                                   (long)(iVar7 - *(int *)((long)local_1268 + 0x24)) * local_1268[1]
                                  + (long)(in_stack_ffffffffffffebdc - (int)local_1268[5]) *
                                    local_1268[2]) * 8)) -
                                *(double *)
                                 (*local_1268 +
                                 ((long)(in_stack_ffffffffffffebd4 - (int)local_1268[4]) +
                                  (long)(local_340 - *(int *)((long)local_1268 + 0x24)) *
                                  local_1268[1] +
                                 (long)(in_stack_ffffffffffffebdc - (int)local_1268[5]) *
                                 local_1268[2]) * 8)) -
                               *(double *)
                                (*local_1268 +
                                ((long)(local_354 - (int)local_1268[4]) +
                                 (long)(local_358 - *(int *)((long)local_1268 + 0x24)) *
                                 local_1268[1] +
                                (long)(in_stack_ffffffffffffebdc - (int)local_1268[5]) *
                                local_1268[2]) * 8)) +
                               *(double *)
                                (*local_1268 +
                                ((long)(in_stack_ffffffffffffebd4 - (int)local_1268[4]) +
                                 (long)(iVar7 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                                (long)(local_374 - (int)local_1268[5]) * local_1268[2]) * 8) +
                               *(double *)
                                (*local_1268 +
                                ((long)(local_384 - (int)local_1268[4]) +
                                 (long)(iVar7 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                                (long)(local_38c - (int)local_1268[5]) * local_1268[2]) * 8) +
                               *(double *)
                                (*local_1268 +
                                ((long)(in_stack_ffffffffffffebd4 - (int)local_1268[4]) +
                                 (long)(local_3a0 - *(int *)((long)local_1268 + 0x24)) *
                                 local_1268[1] +
                                (long)(local_3a4 - (int)local_1268[5]) * local_1268[2]) * 8) +
                              *(double *)
                               (*local_1268 +
                               ((long)(local_3b4 - (int)local_1268[4]) +
                                (long)(local_3b8 - *(int *)((long)local_1268 + 0x24)) *
                                local_1268[1] +
                               (long)(local_3bc - (int)local_1268[5]) * local_1268[2]) * 8)) * 0.25;
                  local_3cc = in_stack_ffffffffffffebd4 + 1;
                  local_3d0 = iVar7 + 1;
                  local_3d4 = in_stack_ffffffffffffebdc + 1;
                  local_3c8 = local_1268;
                  local_3e8 = iVar7 + 1;
                  local_3ec = in_stack_ffffffffffffebdc + 1;
                  local_3e0 = local_1268;
                  local_3fc = in_stack_ffffffffffffebd4 + 1;
                  local_404 = in_stack_ffffffffffffebdc + 1;
                  local_3f8 = local_1268;
                  local_41c = in_stack_ffffffffffffebdc + 1;
                  local_410 = local_1268;
                  local_42c = in_stack_ffffffffffffebd4 + 1;
                  local_430 = iVar7 + 1;
                  local_428 = local_1268;
                  local_448 = iVar7 + 1;
                  local_440 = local_1268;
                  local_45c = in_stack_ffffffffffffebd4 + 1;
                  local_458 = local_1268;
                  local_470 = local_1268;
                  local_488 = local_1308;
                  local_fc0 = ((((((*(double *)
                                     (*local_1268 +
                                     ((long)(local_3cc - (int)local_1268[4]) +
                                      (long)(local_3d0 - *(int *)((long)local_1268 + 0x24)) *
                                      local_1268[1] +
                                     (long)(local_3d4 - (int)local_1268[5]) * local_1268[2]) * 8) -
                                   *(double *)
                                    (*local_1268 +
                                    ((long)(in_stack_ffffffffffffebd4 - (int)local_1268[4]) +
                                     (long)(local_3e8 - *(int *)((long)local_1268 + 0x24)) *
                                     local_1268[1] +
                                    (long)(local_3ec - (int)local_1268[5]) * local_1268[2]) * 8)) -
                                  *(double *)
                                   (*local_1268 +
                                   ((long)(local_3fc - (int)local_1268[4]) +
                                    (long)(iVar7 - *(int *)((long)local_1268 + 0x24)) *
                                    local_1268[1] +
                                   (long)(local_404 - (int)local_1268[5]) * local_1268[2]) * 8)) +
                                  *(double *)
                                   (*local_1268 +
                                   ((long)(in_stack_ffffffffffffebd4 - (int)local_1268[4]) +
                                    (long)(iVar7 - *(int *)((long)local_1268 + 0x24)) *
                                    local_1268[1] +
                                   (long)(local_41c - (int)local_1268[5]) * local_1268[2]) * 8) +
                                 *(double *)
                                  (*local_1268 +
                                  ((long)(local_42c - (int)local_1268[4]) +
                                   (long)(local_430 - *(int *)((long)local_1268 + 0x24)) *
                                   local_1268[1] +
                                  (long)(in_stack_ffffffffffffebdc - (int)local_1268[5]) *
                                  local_1268[2]) * 8)) -
                                *(double *)
                                 (*local_1268 +
                                 ((long)(in_stack_ffffffffffffebd4 - (int)local_1268[4]) +
                                  (long)(local_448 - *(int *)((long)local_1268 + 0x24)) *
                                  local_1268[1] +
                                 (long)(in_stack_ffffffffffffebdc - (int)local_1268[5]) *
                                 local_1268[2]) * 8)) -
                               *(double *)
                                (*local_1268 +
                                ((long)(local_45c - (int)local_1268[4]) +
                                 (long)(iVar7 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                                (long)(in_stack_ffffffffffffebdc - (int)local_1268[5]) *
                                local_1268[2]) * 8)) +
                              *(double *)
                               (*local_1268 +
                               ((long)(in_stack_ffffffffffffebd4 - (int)local_1268[4]) +
                                (long)(iVar7 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                               (long)(in_stack_ffffffffffffebdc - (int)local_1268[5]) *
                               local_1268[2]) * 8)) /
                              *(double *)
                               (*local_1308 +
                               ((long)(in_stack_ffffffffffffebd4 - (int)local_1308[4]) +
                                (long)(iVar7 - *(int *)((long)local_1308 + 0x24)) * local_1308[1] +
                               (long)(in_stack_ffffffffffffebdc - (int)local_1308[5]) *
                               local_1308[2]) * 8);
                  local_4a4 = in_stack_ffffffffffffebd4 + 1;
                  local_4a8 = iVar7 + 1;
                  local_4ac = in_stack_ffffffffffffebdc + 1;
                  local_4a0 = local_1268;
                  local_4c0 = iVar7 + 1;
                  local_4c4 = in_stack_ffffffffffffebdc + 1;
                  local_4b8 = local_1268;
                  local_4d4 = in_stack_ffffffffffffebd4 + 1;
                  local_4dc = in_stack_ffffffffffffebdc + 1;
                  local_4d0 = local_1268;
                  local_4f4 = in_stack_ffffffffffffebdc + 1;
                  local_4e8 = local_1268;
                  local_504 = in_stack_ffffffffffffebd4 + 1;
                  local_508 = iVar7 + 1;
                  local_500 = local_1268;
                  local_520 = iVar7 + 1;
                  local_518 = local_1268;
                  local_534 = in_stack_ffffffffffffebd4 + 1;
                  local_530 = local_1268;
                  local_548 = local_1268;
                  local_560 = local_1308;
                  local_fc8 = (((((((*(double *)
                                      (*local_1268 +
                                      ((long)(local_4a4 - (int)local_1268[4]) +
                                       (long)(local_4a8 - *(int *)((long)local_1268 + 0x24)) *
                                       local_1268[1] +
                                      (long)(local_4ac - (int)local_1268[5]) * local_1268[2]) * 8) -
                                    *(double *)
                                     (*local_1268 +
                                     ((long)(in_stack_ffffffffffffebd4 - (int)local_1268[4]) +
                                      (long)(local_4c0 - *(int *)((long)local_1268 + 0x24)) *
                                      local_1268[1] +
                                     (long)(local_4c4 - (int)local_1268[5]) * local_1268[2]) * 8)) +
                                   *(double *)
                                    (*local_1268 +
                                    ((long)(local_4d4 - (int)local_1268[4]) +
                                     (long)(iVar7 - *(int *)((long)local_1268 + 0x24)) *
                                     local_1268[1] +
                                    (long)(local_4dc - (int)local_1268[5]) * local_1268[2]) * 8)) -
                                  *(double *)
                                   (*local_1268 +
                                   ((long)(in_stack_ffffffffffffebd4 - (int)local_1268[4]) +
                                    (long)(iVar7 - *(int *)((long)local_1268 + 0x24)) *
                                    local_1268[1] +
                                   (long)(local_4f4 - (int)local_1268[5]) * local_1268[2]) * 8)) -
                                 *(double *)
                                  (*local_1268 +
                                  ((long)(local_504 - (int)local_1268[4]) +
                                   (long)(local_508 - *(int *)((long)local_1268 + 0x24)) *
                                   local_1268[1] +
                                  (long)(in_stack_ffffffffffffebdc - (int)local_1268[5]) *
                                  local_1268[2]) * 8)) +
                                *(double *)
                                 (*local_1268 +
                                 ((long)(in_stack_ffffffffffffebd4 - (int)local_1268[4]) +
                                  (long)(local_520 - *(int *)((long)local_1268 + 0x24)) *
                                  local_1268[1] +
                                 (long)(in_stack_ffffffffffffebdc - (int)local_1268[5]) *
                                 local_1268[2]) * 8)) -
                               *(double *)
                                (*local_1268 +
                                ((long)(local_534 - (int)local_1268[4]) +
                                 (long)(iVar7 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                                (long)(in_stack_ffffffffffffebdc - (int)local_1268[5]) *
                                local_1268[2]) * 8)) +
                              *(double *)
                               (*local_1268 +
                               ((long)(in_stack_ffffffffffffebd4 - (int)local_1268[4]) +
                                (long)(iVar7 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                               (long)(in_stack_ffffffffffffebdc - (int)local_1268[5]) *
                               local_1268[2]) * 8)) /
                              *(double *)
                               (*local_1308 +
                               ((long)(in_stack_ffffffffffffebd4 - (int)local_1308[4]) +
                                (long)(iVar7 - *(int *)((long)local_1308 + 0x24)) * local_1308[1] +
                               (long)(in_stack_ffffffffffffebdc - (int)local_1308[5]) *
                               local_1308[2]) * 8);
                  local_57c = in_stack_ffffffffffffebd4 + 1;
                  local_580 = iVar7 + 1;
                  local_584 = in_stack_ffffffffffffebdc + 1;
                  local_578 = local_1268;
                  local_598 = iVar7 + 1;
                  local_59c = in_stack_ffffffffffffebdc + 1;
                  local_590 = local_1268;
                  local_5ac = in_stack_ffffffffffffebd4 + 1;
                  local_5b4 = in_stack_ffffffffffffebdc + 1;
                  local_5a8 = local_1268;
                  local_5cc = in_stack_ffffffffffffebdc + 1;
                  local_5c0 = local_1268;
                  local_5dc = in_stack_ffffffffffffebd4 + 1;
                  local_5e0 = iVar7 + 1;
                  local_5d8 = local_1268;
                  local_5f8 = iVar7 + 1;
                  local_5f0 = local_1268;
                  local_60c = in_stack_ffffffffffffebd4 + 1;
                  local_608 = local_1268;
                  local_620 = local_1268;
                  local_638 = local_1308;
                  local_fd0 = ((((((*(double *)
                                     (*local_1268 +
                                     ((long)(local_57c - (int)local_1268[4]) +
                                      (long)(local_580 - *(int *)((long)local_1268 + 0x24)) *
                                      local_1268[1] +
                                     (long)(local_584 - (int)local_1268[5]) * local_1268[2]) * 8) +
                                   *(double *)
                                    (*local_1268 +
                                    ((long)(in_stack_ffffffffffffebd4 - (int)local_1268[4]) +
                                     (long)(local_598 - *(int *)((long)local_1268 + 0x24)) *
                                     local_1268[1] +
                                    (long)(local_59c - (int)local_1268[5]) * local_1268[2]) * 8)) -
                                  *(double *)
                                   (*local_1268 +
                                   ((long)(local_5ac - (int)local_1268[4]) +
                                    (long)(iVar7 - *(int *)((long)local_1268 + 0x24)) *
                                    local_1268[1] +
                                   (long)(local_5b4 - (int)local_1268[5]) * local_1268[2]) * 8)) -
                                 *(double *)
                                  (*local_1268 +
                                  ((long)(in_stack_ffffffffffffebd4 - (int)local_1268[4]) +
                                   (long)(iVar7 - *(int *)((long)local_1268 + 0x24)) * local_1268[1]
                                  + (long)(local_5cc - (int)local_1268[5]) * local_1268[2]) * 8)) -
                                *(double *)
                                 (*local_1268 +
                                 ((long)(local_5dc - (int)local_1268[4]) +
                                  (long)(local_5e0 - *(int *)((long)local_1268 + 0x24)) *
                                  local_1268[1] +
                                 (long)(in_stack_ffffffffffffebdc - (int)local_1268[5]) *
                                 local_1268[2]) * 8)) -
                               *(double *)
                                (*local_1268 +
                                ((long)(in_stack_ffffffffffffebd4 - (int)local_1268[4]) +
                                 (long)(local_5f8 - *(int *)((long)local_1268 + 0x24)) *
                                 local_1268[1] +
                                (long)(in_stack_ffffffffffffebdc - (int)local_1268[5]) *
                                local_1268[2]) * 8)) +
                               *(double *)
                                (*local_1268 +
                                ((long)(local_60c - (int)local_1268[4]) +
                                 (long)(iVar7 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                                (long)(in_stack_ffffffffffffebdc - (int)local_1268[5]) *
                                local_1268[2]) * 8) +
                              *(double *)
                               (*local_1268 +
                               ((long)(in_stack_ffffffffffffebd4 - (int)local_1268[4]) +
                                (long)(iVar7 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                               (long)(in_stack_ffffffffffffebdc - (int)local_1268[5]) *
                               local_1268[2]) * 8)) /
                              *(double *)
                               (*local_1308 +
                               ((long)(in_stack_ffffffffffffebd4 - (int)local_1308[4]) +
                                (long)(iVar7 - *(int *)((long)local_1308 + 0x24)) * local_1308[1] +
                               (long)(in_stack_ffffffffffffebdc - (int)local_1308[5]) *
                               local_1308[2]) * 8);
                  local_654 = in_stack_ffffffffffffebd4 + 1;
                  local_658 = iVar7 + 1;
                  local_65c = in_stack_ffffffffffffebdc + 1;
                  local_650 = local_1268;
                  local_670 = iVar7 + 1;
                  local_674 = in_stack_ffffffffffffebdc + 1;
                  local_668 = local_1268;
                  local_684 = in_stack_ffffffffffffebd4 + 1;
                  local_68c = in_stack_ffffffffffffebdc + 1;
                  local_680 = local_1268;
                  local_6a4 = in_stack_ffffffffffffebdc + 1;
                  local_698 = local_1268;
                  local_6b4 = in_stack_ffffffffffffebd4 + 1;
                  local_6b8 = iVar7 + 1;
                  local_6b0 = local_1268;
                  local_6d0 = iVar7 + 1;
                  local_6c8 = local_1268;
                  local_6e4 = in_stack_ffffffffffffebd4 + 1;
                  local_6e0 = local_1268;
                  local_6f8 = local_1268;
                  local_710 = local_1308;
                  local_fd8 = ((((((*(double *)
                                     (*local_1268 +
                                     ((long)(local_654 - (int)local_1268[4]) +
                                      (long)(local_658 - *(int *)((long)local_1268 + 0x24)) *
                                      local_1268[1] +
                                     (long)(local_65c - (int)local_1268[5]) * local_1268[2]) * 8) -
                                   *(double *)
                                    (*local_1268 +
                                    ((long)(in_stack_ffffffffffffebd4 - (int)local_1268[4]) +
                                     (long)(local_670 - *(int *)((long)local_1268 + 0x24)) *
                                     local_1268[1] +
                                    (long)(local_674 - (int)local_1268[5]) * local_1268[2]) * 8)) -
                                  *(double *)
                                   (*local_1268 +
                                   ((long)(local_684 - (int)local_1268[4]) +
                                    (long)(iVar7 - *(int *)((long)local_1268 + 0x24)) *
                                    local_1268[1] +
                                   (long)(local_68c - (int)local_1268[5]) * local_1268[2]) * 8)) +
                                 *(double *)
                                  (*local_1268 +
                                  ((long)(in_stack_ffffffffffffebd4 - (int)local_1268[4]) +
                                   (long)(iVar7 - *(int *)((long)local_1268 + 0x24)) * local_1268[1]
                                  + (long)(local_6a4 - (int)local_1268[5]) * local_1268[2]) * 8)) -
                                *(double *)
                                 (*local_1268 +
                                 ((long)(local_6b4 - (int)local_1268[4]) +
                                  (long)(local_6b8 - *(int *)((long)local_1268 + 0x24)) *
                                  local_1268[1] +
                                 (long)(in_stack_ffffffffffffebdc - (int)local_1268[5]) *
                                 local_1268[2]) * 8)) +
                                *(double *)
                                 (*local_1268 +
                                 ((long)(in_stack_ffffffffffffebd4 - (int)local_1268[4]) +
                                  (long)(local_6d0 - *(int *)((long)local_1268 + 0x24)) *
                                  local_1268[1] +
                                 (long)(in_stack_ffffffffffffebdc - (int)local_1268[5]) *
                                 local_1268[2]) * 8) +
                               *(double *)
                                (*local_1268 +
                                ((long)(local_6e4 - (int)local_1268[4]) +
                                 (long)(iVar7 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                                (long)(in_stack_ffffffffffffebdc - (int)local_1268[5]) *
                                local_1268[2]) * 8)) -
                              *(double *)
                               (*local_1268 +
                               ((long)(in_stack_ffffffffffffebd4 - (int)local_1268[4]) +
                                (long)(iVar7 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                               (long)(in_stack_ffffffffffffebdc - (int)local_1268[5]) *
                               local_1268[2]) * 8)) /
                              *(double *)
                               (*local_1308 +
                               ((long)(in_stack_ffffffffffffebd4 - (int)local_1308[4]) +
                                (long)(iVar7 - *(int *)((long)local_1308 + 0x24)) * local_1308[1] +
                               (long)(in_stack_ffffffffffffebdc - (int)local_1308[5]) *
                               local_1308[2]) * 8);
                  local_728 = local_12b8;
                  local_c = 0;
                  local_a8 = 1;
                  local_c0 = 2;
                  local_d8 = 8;
                  local_f20 = local_1220;
                  local_f30 = 0;
                  lVar6 = (long)(in_stack_ffffffffffffebd4 - (int)local_1220[4]) +
                          (long)(iVar7 - *(int *)((long)local_1220 + 0x24)) * local_1220[1] +
                          (long)(in_stack_ffffffffffffebdc - (int)local_1220[5]) * local_1220[2];
                  *(double *)(*local_1220 + lVar6 * 8) =
                       -(*(double *)
                          (*local_12b8 +
                          ((long)(in_stack_ffffffffffffebd4 - (int)local_12b8[4]) +
                           (long)(iVar7 - *(int *)((long)local_12b8 + 0x24)) * local_12b8[1] +
                          (long)(in_stack_ffffffffffffebdc - (int)local_12b8[5]) * local_12b8[2]) *
                          8) * local_1170.arr[0]) *
                       (*(double *)
                         (local_1390 +
                         ((long)(in_stack_ffffffffffffebd4 - local_1370) +
                          (iVar7 - local_136c) * local_1388 +
                          (in_stack_ffffffffffffebdc - local_1368) * local_1380 + local_1378 * 8) *
                         8) * local_fd8 +
                       *(double *)
                        (local_1390 +
                        ((long)(in_stack_ffffffffffffebd4 - local_1370) +
                         (iVar7 - local_136c) * local_1388 +
                         (in_stack_ffffffffffffebdc - local_1368) * local_1380 + local_1378 * 2) * 8
                        ) * 0.5 * local_fc8 +
                       *(double *)
                        (local_1390 +
                        ((long)(in_stack_ffffffffffffebd4 - local_1370) +
                         (iVar7 - local_136c) * local_1388 +
                         (in_stack_ffffffffffffebdc - local_1368) * local_1380 + local_1378) * 8) *
                       0.5 * local_fc0 + local_fa8) + *(double *)(*local_1220 + lVar6 * 8);
                  local_740 = local_12b8;
                  local_1c = 1;
                  local_f0 = 0;
                  local_108 = 2;
                  local_120 = 7;
                  local_f38 = local_1220;
                  local_f48 = 1;
                  lVar6 = (long)(in_stack_ffffffffffffebd4 - (int)local_1220[4]) +
                          (long)(iVar7 - *(int *)((long)local_1220 + 0x24)) * local_1220[1] +
                          (long)(in_stack_ffffffffffffebdc - (int)local_1220[5]) * local_1220[2] +
                          local_1220[3];
                  *(double *)(*local_1220 + lVar6 * 8) =
                       -(*(double *)
                          (*local_12b8 +
                          ((long)(in_stack_ffffffffffffebd4 - (int)local_12b8[4]) +
                           (long)(iVar7 - *(int *)((long)local_12b8 + 0x24)) * local_12b8[1] +
                          (long)(in_stack_ffffffffffffebdc - (int)local_12b8[5]) * local_12b8[2]) *
                          8) * local_1170.arr[1]) *
                       (*(double *)
                         (local_1390 +
                         ((long)(in_stack_ffffffffffffebd4 - local_1370) +
                          (iVar7 - local_136c) * local_1388 +
                          (in_stack_ffffffffffffebdc - local_1368) * local_1380 + local_1378 * 7) *
                         8) * local_fd8 +
                       *(double *)
                        (local_1390 +
                        ((long)(in_stack_ffffffffffffebd4 - local_1370) +
                         (iVar7 - local_136c) * local_1388 +
                         (in_stack_ffffffffffffebdc - local_1368) * local_1380 + local_1378 * 2) * 8
                        ) * 0.5 * local_fd0 +
                       *(double *)
                        (local_1390 +
                        ((long)(in_stack_ffffffffffffebd4 - local_1370) +
                         (iVar7 - local_136c) * local_1388 +
                        (in_stack_ffffffffffffebdc - local_1368) * local_1380) * 8) * 0.5 *
                       local_fc0 + local_fb0) + *(double *)(*local_1220 + lVar6 * 8);
                  local_758 = local_12b8;
                  local_2c = 2;
                  local_138 = 0;
                  local_150 = 1;
                  local_168 = 6;
                  local_f50 = local_1220;
                  local_f60 = 2;
                  lVar6 = (long)(in_stack_ffffffffffffebd4 - (int)local_1220[4]) +
                          (long)(iVar7 - *(int *)((long)local_1220 + 0x24)) * local_1220[1] +
                          (long)(in_stack_ffffffffffffebdc - (int)local_1220[5]) * local_1220[2] +
                          local_1220[3] * 2;
                  *(double *)(*local_1220 + lVar6 * 8) =
                       -(*(double *)
                          (*local_12b8 +
                          ((long)(in_stack_ffffffffffffebd4 - (int)local_12b8[4]) +
                           (long)(iVar7 - *(int *)((long)local_12b8 + 0x24)) * local_12b8[1] +
                          (long)(in_stack_ffffffffffffebdc - (int)local_12b8[5]) * local_12b8[2]) *
                          8) * local_1170.arr[2]) *
                       (*(double *)
                         (local_1390 +
                         ((long)(in_stack_ffffffffffffebd4 - local_1370) +
                          (iVar7 - local_136c) * local_1388 +
                          (in_stack_ffffffffffffebdc - local_1368) * local_1380 + local_1378 * 6) *
                         8) * local_fd8 +
                       *(double *)
                        (local_1390 +
                        ((long)(in_stack_ffffffffffffebd4 - local_1370) +
                         (iVar7 - local_136c) * local_1388 +
                         (in_stack_ffffffffffffebdc - local_1368) * local_1380 + local_1378) * 8) *
                       0.5 * local_fd0 +
                       *(double *)
                        (local_1390 +
                        ((long)(in_stack_ffffffffffffebd4 - local_1370) +
                         (iVar7 - local_136c) * local_1388 +
                        (in_stack_ffffffffffffebdc - local_1368) * local_1380) * 8) * 0.5 *
                       local_fc8 + local_fb8) + *(double *)(*local_1220 + lVar6 * 8);
                  local_f5c = in_stack_ffffffffffffebdc;
                  local_f58 = iVar7;
                  local_f54 = in_stack_ffffffffffffebd4;
                  local_f44 = in_stack_ffffffffffffebdc;
                  local_f40 = iVar7;
                  local_f3c = in_stack_ffffffffffffebd4;
                  local_f2c = in_stack_ffffffffffffebdc;
                  local_f28 = iVar7;
                  local_f24 = in_stack_ffffffffffffebd4;
                  local_764 = in_stack_ffffffffffffebdc;
                  local_760 = iVar7;
                  local_75c = in_stack_ffffffffffffebd4;
                  local_74c = in_stack_ffffffffffffebdc;
                  local_748 = iVar7;
                  local_744 = in_stack_ffffffffffffebd4;
                  local_734 = in_stack_ffffffffffffebdc;
                  local_730 = iVar7;
                  local_72c = in_stack_ffffffffffffebd4;
                  local_71c = in_stack_ffffffffffffebdc;
                  local_718 = iVar7;
                  local_714 = in_stack_ffffffffffffebd4;
                  local_704 = in_stack_ffffffffffffebdc;
                  local_700 = iVar7;
                  local_6fc = in_stack_ffffffffffffebd4;
                  local_6ec = in_stack_ffffffffffffebdc;
                  local_6e8 = iVar7;
                  local_6d4 = in_stack_ffffffffffffebdc;
                  local_6cc = in_stack_ffffffffffffebd4;
                  local_6bc = in_stack_ffffffffffffebdc;
                  local_6a0 = iVar7;
                  local_69c = in_stack_ffffffffffffebd4;
                  local_688 = iVar7;
                  local_66c = in_stack_ffffffffffffebd4;
                  local_644 = in_stack_ffffffffffffebdc;
                  local_640 = iVar7;
                  local_63c = in_stack_ffffffffffffebd4;
                  local_62c = in_stack_ffffffffffffebdc;
                  local_628 = iVar7;
                  local_624 = in_stack_ffffffffffffebd4;
                  local_614 = in_stack_ffffffffffffebdc;
                  local_610 = iVar7;
                  local_5fc = in_stack_ffffffffffffebdc;
                  local_5f4 = in_stack_ffffffffffffebd4;
                  local_5e4 = in_stack_ffffffffffffebdc;
                  local_5c8 = iVar7;
                  local_5c4 = in_stack_ffffffffffffebd4;
                  local_5b0 = iVar7;
                  local_594 = in_stack_ffffffffffffebd4;
                  local_56c = in_stack_ffffffffffffebdc;
                  local_568 = iVar7;
                  local_564 = in_stack_ffffffffffffebd4;
                  local_554 = in_stack_ffffffffffffebdc;
                  local_550 = iVar7;
                  local_54c = in_stack_ffffffffffffebd4;
                  local_53c = in_stack_ffffffffffffebdc;
                  local_538 = iVar7;
                  local_524 = in_stack_ffffffffffffebdc;
                  local_51c = in_stack_ffffffffffffebd4;
                  local_50c = in_stack_ffffffffffffebdc;
                  local_4f0 = iVar7;
                  local_4ec = in_stack_ffffffffffffebd4;
                  local_4d8 = iVar7;
                  local_4bc = in_stack_ffffffffffffebd4;
                  local_494 = in_stack_ffffffffffffebdc;
                  local_490 = iVar7;
                  local_48c = in_stack_ffffffffffffebd4;
                  local_47c = in_stack_ffffffffffffebdc;
                  local_478 = iVar7;
                  local_474 = in_stack_ffffffffffffebd4;
                  local_464 = in_stack_ffffffffffffebdc;
                  local_460 = iVar7;
                  local_44c = in_stack_ffffffffffffebdc;
                  local_444 = in_stack_ffffffffffffebd4;
                  local_434 = in_stack_ffffffffffffebdc;
                  local_418 = iVar7;
                  local_414 = in_stack_ffffffffffffebd4;
                  local_400 = iVar7;
                  local_3e4 = in_stack_ffffffffffffebd4;
                  local_39c = in_stack_ffffffffffffebd4;
                  local_388 = iVar7;
                  local_370 = iVar7;
                  local_36c = in_stack_ffffffffffffebd4;
                  local_35c = in_stack_ffffffffffffebdc;
                  local_344 = in_stack_ffffffffffffebdc;
                  local_33c = in_stack_ffffffffffffebd4;
                  local_32c = in_stack_ffffffffffffebdc;
                  local_328 = iVar7;
                  local_314 = in_stack_ffffffffffffebdc;
                  local_310 = iVar7;
                  local_30c = in_stack_ffffffffffffebd4;
                  local_2dc = in_stack_ffffffffffffebd4;
                  local_2c8 = iVar7;
                  local_2b0 = iVar7;
                  local_2ac = in_stack_ffffffffffffebd4;
                  local_29c = in_stack_ffffffffffffebdc;
                  local_284 = in_stack_ffffffffffffebdc;
                  local_27c = in_stack_ffffffffffffebd4;
                  local_26c = in_stack_ffffffffffffebdc;
                  local_268 = iVar7;
                  local_254 = in_stack_ffffffffffffebdc;
                  local_250 = iVar7;
                  local_24c = in_stack_ffffffffffffebd4;
                  local_21c = in_stack_ffffffffffffebd4;
                  local_208 = iVar7;
                  local_1f0 = iVar7;
                  local_1ec = in_stack_ffffffffffffebd4;
                  local_1dc = in_stack_ffffffffffffebdc;
                  local_1c4 = in_stack_ffffffffffffebdc;
                  local_1bc = in_stack_ffffffffffffebd4;
                  local_1ac = in_stack_ffffffffffffebdc;
                  local_1a8 = iVar7;
                  local_194 = in_stack_ffffffffffffebdc;
                  local_190 = iVar7;
                  local_18c = in_stack_ffffffffffffebd4;
                  local_164 = in_stack_ffffffffffffebdc;
                  local_160 = iVar7;
                  local_15c = in_stack_ffffffffffffebd4;
                  local_158 = local_1350;
                  local_14c = in_stack_ffffffffffffebdc;
                  local_148 = iVar7;
                  local_144 = in_stack_ffffffffffffebd4;
                  local_140 = local_1350;
                  local_134 = in_stack_ffffffffffffebdc;
                  local_130 = iVar7;
                  local_12c = in_stack_ffffffffffffebd4;
                  local_128 = local_1350;
                  local_11c = in_stack_ffffffffffffebdc;
                  local_118 = iVar7;
                  local_114 = in_stack_ffffffffffffebd4;
                  local_110 = local_1350;
                  local_104 = in_stack_ffffffffffffebdc;
                  local_100 = iVar7;
                  local_fc = in_stack_ffffffffffffebd4;
                  local_f8 = local_1350;
                  local_ec = in_stack_ffffffffffffebdc;
                  local_e8 = iVar7;
                  local_e4 = in_stack_ffffffffffffebd4;
                  local_e0 = local_1350;
                  local_d4 = in_stack_ffffffffffffebdc;
                  local_d0 = iVar7;
                  local_cc = in_stack_ffffffffffffebd4;
                  local_c8 = local_1350;
                  local_bc = in_stack_ffffffffffffebdc;
                  local_b8 = iVar7;
                  local_b4 = in_stack_ffffffffffffebd4;
                  local_b0 = local_1350;
                  local_a4 = in_stack_ffffffffffffebdc;
                  local_a0 = iVar7;
                  local_9c = in_stack_ffffffffffffebd4;
                  local_98 = local_1350;
                  local_28 = local_fa0;
                  local_18 = local_fa0;
                  local_8 = local_fa0;
                }
                else {
                  local_ed8 = local_1220;
                  local_ee8 = 2;
                  *(undefined8 *)
                   (*local_1220 +
                   ((long)(in_stack_ffffffffffffebd4 - (int)local_1220[4]) +
                    (long)(iVar7 - *(int *)((long)local_1220 + 0x24)) * local_1220[1] +
                    (long)(in_stack_ffffffffffffebdc - (int)local_1220[5]) * local_1220[2] +
                   local_1220[3] * 2) * 8) = 0;
                  local_ef0 = local_1220;
                  local_f00 = 1;
                  *(undefined8 *)
                   (*local_1220 +
                   ((long)(in_stack_ffffffffffffebd4 - (int)local_1220[4]) +
                    (long)(iVar7 - *(int *)((long)local_1220 + 0x24)) * local_1220[1] +
                    (long)(in_stack_ffffffffffffebdc - (int)local_1220[5]) * local_1220[2] +
                   local_1220[3]) * 8) = 0;
                  local_f08 = local_1220;
                  local_f18 = 0;
                  *(undefined8 *)
                   (*local_1220 +
                   ((long)(in_stack_ffffffffffffebd4 - (int)local_1220[4]) +
                    (long)(iVar7 - *(int *)((long)local_1220 + 0x24)) * local_1220[1] +
                   (long)(in_stack_ffffffffffffebdc - (int)local_1220[5]) * local_1220[2]) * 8) = 0;
                  local_f14 = in_stack_ffffffffffffebdc;
                  local_f10 = iVar7;
                  local_f0c = in_stack_ffffffffffffebd4;
                  local_efc = in_stack_ffffffffffffebdc;
                  local_ef8 = iVar7;
                  local_ef4 = in_stack_ffffffffffffebd4;
                  local_ee4 = in_stack_ffffffffffffebdc;
                  local_ee0 = iVar7;
                  local_edc = in_stack_ffffffffffffebd4;
                }
                local_f98 = local_1350;
                local_f6c = in_stack_ffffffffffffebdc;
                local_f68 = iVar7;
                local_f64 = in_stack_ffffffffffffebd4;
                local_17c = in_stack_ffffffffffffebdc;
                local_178 = iVar7;
                local_174 = in_stack_ffffffffffffebd4;
                iVar2 = in_stack_ffffffffffffebd4 + 1;
              }
            }
            in_stack_ffffffffffffebd8 = iVar7;
          }
        }
        else {
          local_12a9 = 1;
        }
      }
      if ((local_12a9 & 1) != 0) {
        bVar3 = std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                           0x1732797);
        if (bVar3) {
          std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                    ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x17327ad
                    );
          in_stack_ffffffffffffeaa8 = (MFIter *)&stack0xffffffffffffeb88;
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (this_01,(MFIter *)in_stack_ffffffffffffeab0);
          local_10f8 = local_11f8;
          local_c68 = local_11f8;
          local_c6c = 0;
          local_10ec = *local_11f8;
          local_c78 = local_11f8;
          local_c7c = 1;
          iStack_10e8 = local_11f8[1];
          local_1108 = *(undefined8 *)local_11f8;
          local_c88 = local_11f8;
          local_c8c = 2;
          local_1100 = local_11f8[2];
          local_1058 = local_11f8;
          local_d28 = local_11f8 + 3;
          local_d2c = 0;
          local_104c = *local_d28;
          local_d38 = local_11f8 + 3;
          local_d3c = 1;
          iStack_1048 = local_11f8[4];
          local_1068 = *(undefined8 *)local_d28;
          local_d48 = local_11f8 + 3;
          local_d4c = 2;
          local_1060 = local_11f8[5];
          for (local_14bc = local_1100; local_14c0 = iStack_10e8,
              local_1438 = in_stack_ffffffffffffeaa8, local_10e4 = local_1100,
              local_1044 = local_1060, local_14bc <= local_1060; local_14bc = local_14bc + 1) {
            for (; local_14c4 = local_10ec, local_14c0 <= iStack_1048; local_14c0 = local_14c0 + 1)
            {
              for (; local_14c4 <= local_104c; local_14c4 = local_14c4 + 1) {
                local_e8c = local_14c4;
                local_e90 = local_14c0;
                local_e94 = local_14bc;
                local_ea0 = local_1220;
                local_ea8 = local_1268;
                local_eb8 = &local_1170;
                local_3c = 0;
                local_ec0 = local_1170.arr[0] * 0.25;
                local_4c = 1;
                local_ec8 = local_1170.arr[1] * 0.25;
                local_5c = 2;
                local_ed0 = local_1170.arr[2] * 0.25;
                local_774 = local_14c4;
                local_778 = local_14c0;
                local_77c = local_14bc;
                local_788 = local_1268;
                local_78c = local_14c4;
                local_790 = local_14c0;
                local_794 = local_14bc;
                local_7a0 = local_1268;
                local_7a4 = local_14c4 + 1;
                local_7a8 = local_14c0;
                local_7ac = local_14bc;
                local_7b8 = local_1268;
                local_7bc = local_14c4;
                local_7c0 = local_14c0 + 1;
                local_7c4 = local_14bc;
                local_7d0 = local_1268;
                local_7d4 = local_14c4 + 1;
                local_7d8 = local_14c0 + 1;
                local_7dc = local_14bc;
                local_7e8 = local_1268;
                local_7ec = local_14c4;
                local_7f0 = local_14c0;
                local_7f4 = local_14bc + 1;
                local_800 = local_1268;
                local_804 = local_14c4 + 1;
                local_808 = local_14c0;
                local_80c = local_14bc + 1;
                local_818 = local_1268;
                local_81c = local_14c4;
                local_820 = local_14c0 + 1;
                local_824 = local_14bc + 1;
                local_830 = local_1268;
                local_834 = local_14c4 + 1;
                local_838 = local_14c0 + 1;
                local_83c = local_14bc + 1;
                local_e48 = local_1220;
                local_e4c = local_14c4;
                local_e50 = local_14c0;
                local_e54 = local_14bc;
                local_e58 = 0;
                lVar6 = (long)(local_14c4 - (int)local_1220[4]) +
                        (long)(local_14c0 - *(int *)((long)local_1220 + 0x24)) * local_1220[1] +
                        (long)(local_14bc - (int)local_1220[5]) * local_1220[2];
                *(double *)(*local_1220 + lVar6 * 8) =
                     -(*(double *)
                        ((long)&((in_stack_ffffffffffffeaa8->m_fa)._M_t.
                                 super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                 .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl)
                                ->_vptr_FabArrayBase +
                        ((long)(local_14c4 - in_stack_ffffffffffffeaa8->currentIndex) +
                         (long)(local_14c0 - in_stack_ffffffffffffeaa8->beginIndex) *
                         (long)in_stack_ffffffffffffeaa8->fabArray +
                        (long)(local_14bc - in_stack_ffffffffffffeaa8->endIndex) *
                        *(long *)(in_stack_ffffffffffffeaa8->tile_size).vect) * 8) * local_ec0) *
                     (((((((-*(double *)
                              (*local_1268 +
                              ((long)(local_14c4 - (int)local_1268[4]) +
                               (long)(local_14c0 - *(int *)((long)local_1268 + 0x24)) *
                               local_1268[1] +
                              (long)(local_14bc - (int)local_1268[5]) * local_1268[2]) * 8) +
                           *(double *)
                            (*local_1268 +
                            ((long)(local_7a4 - (int)local_1268[4]) +
                             (long)(local_14c0 - *(int *)((long)local_1268 + 0x24)) * local_1268[1]
                            + (long)(local_14bc - (int)local_1268[5]) * local_1268[2]) * 8)) -
                          *(double *)
                           (*local_1268 +
                           ((long)(local_14c4 - (int)local_1268[4]) +
                            (long)(local_7c0 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                           (long)(local_14bc - (int)local_1268[5]) * local_1268[2]) * 8)) +
                         *(double *)
                          (*local_1268 +
                          ((long)(local_7d4 - (int)local_1268[4]) +
                           (long)(local_7d8 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                          (long)(local_14bc - (int)local_1268[5]) * local_1268[2]) * 8)) -
                        *(double *)
                         (*local_1268 +
                         ((long)(local_14c4 - (int)local_1268[4]) +
                          (long)(local_14c0 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                         (long)(local_7f4 - (int)local_1268[5]) * local_1268[2]) * 8)) +
                       *(double *)
                        (*local_1268 +
                        ((long)(local_804 - (int)local_1268[4]) +
                         (long)(local_14c0 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                        (long)(local_80c - (int)local_1268[5]) * local_1268[2]) * 8)) -
                      *(double *)
                       (*local_1268 +
                       ((long)(local_14c4 - (int)local_1268[4]) +
                        (long)(local_820 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                       (long)(local_824 - (int)local_1268[5]) * local_1268[2]) * 8)) +
                     *(double *)
                      (*local_1268 +
                      ((long)(local_834 - (int)local_1268[4]) +
                       (long)(local_838 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                      (long)(local_83c - (int)local_1268[5]) * local_1268[2]) * 8)) +
                     *(double *)(*local_1220 + lVar6 * 8);
                local_84c = local_14c4;
                local_850 = local_14c0;
                local_854 = local_14bc;
                local_860 = local_1268;
                local_864 = local_14c4;
                local_868 = local_14c0;
                local_86c = local_14bc;
                local_878 = local_1268;
                local_87c = local_14c4 + 1;
                local_880 = local_14c0;
                local_884 = local_14bc;
                local_890 = local_1268;
                local_894 = local_14c4;
                local_898 = local_14c0 + 1;
                local_89c = local_14bc;
                local_8a8 = local_1268;
                local_8ac = local_14c4 + 1;
                local_8b0 = local_14c0 + 1;
                local_8b4 = local_14bc;
                local_8c0 = local_1268;
                local_8c4 = local_14c4;
                local_8c8 = local_14c0;
                local_8cc = local_14bc + 1;
                local_8d8 = local_1268;
                local_8dc = local_14c4 + 1;
                local_8e0 = local_14c0;
                local_8e4 = local_14bc + 1;
                local_8f0 = local_1268;
                local_8f4 = local_14c4;
                local_8f8 = local_14c0 + 1;
                local_8fc = local_14bc + 1;
                local_908 = local_1268;
                local_90c = local_14c4 + 1;
                local_910 = local_14c0 + 1;
                local_914 = local_14bc + 1;
                local_e60 = local_1220;
                local_e64 = local_14c4;
                local_e68 = local_14c0;
                local_e6c = local_14bc;
                local_e70 = 1;
                lVar6 = (long)(local_14c4 - (int)local_1220[4]) +
                        (long)(local_14c0 - *(int *)((long)local_1220 + 0x24)) * local_1220[1] +
                        (long)(local_14bc - (int)local_1220[5]) * local_1220[2] + local_1220[3];
                *(double *)(*local_1220 + lVar6 * 8) =
                     -(*(double *)
                        ((long)&((in_stack_ffffffffffffeaa8->m_fa)._M_t.
                                 super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                 .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl)
                                ->_vptr_FabArrayBase +
                        ((long)(local_14c4 - in_stack_ffffffffffffeaa8->currentIndex) +
                         (long)(local_14c0 - in_stack_ffffffffffffeaa8->beginIndex) *
                         (long)in_stack_ffffffffffffeaa8->fabArray +
                        (long)(local_14bc - in_stack_ffffffffffffeaa8->endIndex) *
                        *(long *)(in_stack_ffffffffffffeaa8->tile_size).vect) * 8) * local_ec8) *
                     (((((-*(double *)
                            (*local_1268 +
                            ((long)(local_14c4 - (int)local_1268[4]) +
                             (long)(local_14c0 - *(int *)((long)local_1268 + 0x24)) * local_1268[1]
                            + (long)(local_14bc - (int)local_1268[5]) * local_1268[2]) * 8) -
                         *(double *)
                          (*local_1268 +
                          ((long)(local_87c - (int)local_1268[4]) +
                           (long)(local_14c0 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                          (long)(local_14bc - (int)local_1268[5]) * local_1268[2]) * 8)) +
                         *(double *)
                          (*local_1268 +
                          ((long)(local_14c4 - (int)local_1268[4]) +
                           (long)(local_898 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                          (long)(local_14bc - (int)local_1268[5]) * local_1268[2]) * 8) +
                        *(double *)
                         (*local_1268 +
                         ((long)(local_8ac - (int)local_1268[4]) +
                          (long)(local_8b0 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                         (long)(local_14bc - (int)local_1268[5]) * local_1268[2]) * 8)) -
                       *(double *)
                        (*local_1268 +
                        ((long)(local_14c4 - (int)local_1268[4]) +
                         (long)(local_14c0 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                        (long)(local_8cc - (int)local_1268[5]) * local_1268[2]) * 8)) -
                      *(double *)
                       (*local_1268 +
                       ((long)(local_8dc - (int)local_1268[4]) +
                        (long)(local_14c0 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                       (long)(local_8e4 - (int)local_1268[5]) * local_1268[2]) * 8)) +
                      *(double *)
                       (*local_1268 +
                       ((long)(local_14c4 - (int)local_1268[4]) +
                        (long)(local_8f8 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                       (long)(local_8fc - (int)local_1268[5]) * local_1268[2]) * 8) +
                     *(double *)
                      (*local_1268 +
                      ((long)(local_90c - (int)local_1268[4]) +
                       (long)(local_910 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                      (long)(local_914 - (int)local_1268[5]) * local_1268[2]) * 8)) +
                     *(double *)(*local_1220 + lVar6 * 8);
                local_924 = local_14c4;
                local_928 = local_14c0;
                local_92c = local_14bc;
                local_938 = local_1268;
                local_93c = local_14c4;
                local_940 = local_14c0;
                local_944 = local_14bc;
                local_950 = local_1268;
                local_954 = local_14c4 + 1;
                local_958 = local_14c0;
                local_95c = local_14bc;
                local_968 = local_1268;
                local_96c = local_14c4;
                local_970 = local_14c0 + 1;
                local_974 = local_14bc;
                local_980 = local_1268;
                local_984 = local_14c4 + 1;
                local_988 = local_14c0 + 1;
                local_98c = local_14bc;
                local_998 = local_1268;
                local_99c = local_14c4;
                local_9a0 = local_14c0;
                local_9a4 = local_14bc + 1;
                local_9b0 = local_1268;
                local_9b4 = local_14c4 + 1;
                local_9b8 = local_14c0;
                local_9bc = local_14bc + 1;
                local_9c8 = local_1268;
                local_9cc = local_14c4;
                local_9d0 = local_14c0 + 1;
                local_9d4 = local_14bc + 1;
                local_9e0 = local_1268;
                local_9e4 = local_14c4 + 1;
                local_9e8 = local_14c0 + 1;
                local_9ec = local_14bc + 1;
                local_e78 = local_1220;
                local_e7c = local_14c4;
                local_e80 = local_14c0;
                local_e84 = local_14bc;
                local_e88 = 2;
                lVar6 = (long)(local_14c4 - (int)local_1220[4]) +
                        (long)(local_14c0 - *(int *)((long)local_1220 + 0x24)) * local_1220[1] +
                        (long)(local_14bc - (int)local_1220[5]) * local_1220[2] + local_1220[3] * 2;
                *(double *)(*local_1220 + lVar6 * 8) =
                     -(*(double *)
                        ((long)&((in_stack_ffffffffffffeaa8->m_fa)._M_t.
                                 super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                 .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl)
                                ->_vptr_FabArrayBase +
                        ((long)(local_14c4 - in_stack_ffffffffffffeaa8->currentIndex) +
                         (long)(local_14c0 - in_stack_ffffffffffffeaa8->beginIndex) *
                         (long)in_stack_ffffffffffffeaa8->fabArray +
                        (long)(local_14bc - in_stack_ffffffffffffeaa8->endIndex) *
                        *(long *)(in_stack_ffffffffffffeaa8->tile_size).vect) * 8) * local_ed0) *
                     ((((-*(double *)
                           (*local_1268 +
                           ((long)(local_14c4 - (int)local_1268[4]) +
                            (long)(local_14c0 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                           (long)(local_14bc - (int)local_1268[5]) * local_1268[2]) * 8) -
                        *(double *)
                         (*local_1268 +
                         ((long)(local_954 - (int)local_1268[4]) +
                          (long)(local_14c0 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                         (long)(local_14bc - (int)local_1268[5]) * local_1268[2]) * 8)) -
                       *(double *)
                        (*local_1268 +
                        ((long)(local_14c4 - (int)local_1268[4]) +
                         (long)(local_970 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                        (long)(local_14bc - (int)local_1268[5]) * local_1268[2]) * 8)) -
                      *(double *)
                       (*local_1268 +
                       ((long)(local_984 - (int)local_1268[4]) +
                        (long)(local_988 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                       (long)(local_14bc - (int)local_1268[5]) * local_1268[2]) * 8)) +
                      *(double *)
                       (*local_1268 +
                       ((long)(local_14c4 - (int)local_1268[4]) +
                        (long)(local_14c0 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                       (long)(local_9a4 - (int)local_1268[5]) * local_1268[2]) * 8) +
                      *(double *)
                       (*local_1268 +
                       ((long)(local_9b4 - (int)local_1268[4]) +
                        (long)(local_14c0 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                       (long)(local_9bc - (int)local_1268[5]) * local_1268[2]) * 8) +
                      *(double *)
                       (*local_1268 +
                       ((long)(local_14c4 - (int)local_1268[4]) +
                        (long)(local_9d0 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                       (long)(local_9d4 - (int)local_1268[5]) * local_1268[2]) * 8) +
                     *(double *)
                      (*local_1268 +
                      ((long)(local_9e4 - (int)local_1268[4]) +
                       (long)(local_9e8 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                      (long)(local_9ec - (int)local_1268[5]) * local_1268[2]) * 8)) +
                     *(double *)(*local_1220 + lVar6 * 8);
                local_eb0 = in_stack_ffffffffffffeaa8;
                local_920 = in_stack_ffffffffffffeaa8;
                local_848 = in_stack_ffffffffffffeaa8;
                local_770 = in_stack_ffffffffffffeaa8;
                local_58 = local_eb8;
                local_48 = local_eb8;
                local_38 = local_eb8;
              }
            }
          }
        }
        else {
          dVar1 = *(double *)(in_RDI[5].n_grow.vect + 2);
          local_1120 = local_11f8;
          local_c38 = local_11f8;
          local_c3c = 0;
          local_1114 = *local_11f8;
          local_c48 = local_11f8;
          local_c4c = 1;
          iStack_1110 = local_11f8[1];
          in_stack_ffffffffffffeb10 = *(MFIter **)local_11f8;
          local_c58 = local_11f8;
          local_c5c = 2;
          local_1128 = local_11f8[2];
          local_1080 = local_11f8;
          local_cf8 = local_11f8 + 3;
          local_cfc = 0;
          local_1074 = *local_cf8;
          local_d08 = local_11f8 + 3;
          local_d0c = 1;
          iStack_1070 = local_11f8[4];
          local_1090 = *(undefined8 *)local_cf8;
          local_d18 = local_11f8 + 3;
          local_d1c = 2;
          local_1088 = local_11f8[5];
          for (local_1514 = local_1128; local_1518 = iStack_1110,
              local_1130 = in_stack_ffffffffffffeb10, local_110c = local_1128,
              local_106c = local_1088, local_1514 <= local_1088; local_1514 = local_1514 + 1) {
            for (; iVar7 = local_1114, local_1518 <= iStack_1070; local_1518 = local_1518 + 1) {
              while (in_stack_ffffffffffffeae4 = iVar7, in_stack_ffffffffffffeae4 <= local_1074) {
                local_e00 = local_1518;
                local_e04 = local_1514;
                local_e10 = local_1220;
                local_e18 = local_1268;
                local_e28 = &local_1170;
                local_6c = 0;
                local_e30 = local_1170.arr[0] * 0.25;
                local_7c = 1;
                local_e38 = local_1170.arr[1] * 0.25;
                local_8c = 2;
                local_e40 = local_1170.arr[2] * 0.25;
                local_9f8 = local_1268;
                local_a00 = local_1518;
                local_a04 = local_1514;
                local_a10 = local_1268;
                local_a14 = in_stack_ffffffffffffeae4 + 1;
                local_a18 = local_1518;
                local_a1c = local_1514;
                local_a28 = local_1268;
                local_a30 = local_1518 + 1;
                local_a34 = local_1514;
                local_a40 = local_1268;
                local_a44 = in_stack_ffffffffffffeae4 + 1;
                local_a48 = local_1518 + 1;
                local_a4c = local_1514;
                local_a58 = local_1268;
                local_a60 = local_1518;
                local_a64 = local_1514 + 1;
                local_a70 = local_1268;
                local_a74 = in_stack_ffffffffffffeae4 + 1;
                local_a78 = local_1518;
                local_a7c = local_1514 + 1;
                local_a88 = local_1268;
                local_a90 = local_1518 + 1;
                local_a94 = local_1514 + 1;
                local_aa0 = local_1268;
                local_aa4 = in_stack_ffffffffffffeae4 + 1;
                local_aa8 = local_1518 + 1;
                local_aac = local_1514 + 1;
                local_db8 = local_1220;
                local_dc0 = local_1518;
                local_dc4 = local_1514;
                local_dc8 = 0;
                lVar6 = (long)(in_stack_ffffffffffffeae4 - (int)local_1220[4]) +
                        (long)(local_1518 - *(int *)((long)local_1220 + 0x24)) * local_1220[1] +
                        (long)(local_1514 - (int)local_1220[5]) * local_1220[2];
                *(double *)(*local_1220 + lVar6 * 8) =
                     -(dVar1 * local_e30) *
                     (((((((-*(double *)
                              (*local_1268 +
                              ((long)(in_stack_ffffffffffffeae4 - (int)local_1268[4]) +
                               (long)(local_1518 - *(int *)((long)local_1268 + 0x24)) *
                               local_1268[1] +
                              (long)(local_1514 - (int)local_1268[5]) * local_1268[2]) * 8) +
                           *(double *)
                            (*local_1268 +
                            ((long)(local_a14 - (int)local_1268[4]) +
                             (long)(local_1518 - *(int *)((long)local_1268 + 0x24)) * local_1268[1]
                            + (long)(local_1514 - (int)local_1268[5]) * local_1268[2]) * 8)) -
                          *(double *)
                           (*local_1268 +
                           ((long)(in_stack_ffffffffffffeae4 - (int)local_1268[4]) +
                            (long)(local_a30 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                           (long)(local_1514 - (int)local_1268[5]) * local_1268[2]) * 8)) +
                         *(double *)
                          (*local_1268 +
                          ((long)(local_a44 - (int)local_1268[4]) +
                           (long)(local_a48 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                          (long)(local_1514 - (int)local_1268[5]) * local_1268[2]) * 8)) -
                        *(double *)
                         (*local_1268 +
                         ((long)(in_stack_ffffffffffffeae4 - (int)local_1268[4]) +
                          (long)(local_1518 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                         (long)(local_a64 - (int)local_1268[5]) * local_1268[2]) * 8)) +
                       *(double *)
                        (*local_1268 +
                        ((long)(local_a74 - (int)local_1268[4]) +
                         (long)(local_1518 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                        (long)(local_a7c - (int)local_1268[5]) * local_1268[2]) * 8)) -
                      *(double *)
                       (*local_1268 +
                       ((long)(in_stack_ffffffffffffeae4 - (int)local_1268[4]) +
                        (long)(local_a90 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                       (long)(local_a94 - (int)local_1268[5]) * local_1268[2]) * 8)) +
                     *(double *)
                      (*local_1268 +
                      ((long)(local_aa4 - (int)local_1268[4]) +
                       (long)(local_aa8 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                      (long)(local_aac - (int)local_1268[5]) * local_1268[2]) * 8)) +
                     *(double *)(*local_1220 + lVar6 * 8);
                local_ab8 = local_1268;
                local_ac0 = local_1518;
                local_ac4 = local_1514;
                local_ad0 = local_1268;
                local_ad4 = in_stack_ffffffffffffeae4 + 1;
                local_ad8 = local_1518;
                local_adc = local_1514;
                local_ae8 = local_1268;
                local_af0 = local_1518 + 1;
                local_af4 = local_1514;
                local_b00 = local_1268;
                local_b04 = in_stack_ffffffffffffeae4 + 1;
                local_b08 = local_1518 + 1;
                local_b0c = local_1514;
                local_b18 = local_1268;
                local_b20 = local_1518;
                local_b24 = local_1514 + 1;
                local_b30 = local_1268;
                local_b34 = in_stack_ffffffffffffeae4 + 1;
                local_b38 = local_1518;
                local_b3c = local_1514 + 1;
                local_b48 = local_1268;
                local_b50 = local_1518 + 1;
                local_b54 = local_1514 + 1;
                local_b60 = local_1268;
                local_b64 = in_stack_ffffffffffffeae4 + 1;
                local_b68 = local_1518 + 1;
                local_b6c = local_1514 + 1;
                local_dd0 = local_1220;
                local_dd8 = local_1518;
                local_ddc = local_1514;
                local_de0 = 1;
                lVar6 = (long)(in_stack_ffffffffffffeae4 - (int)local_1220[4]) +
                        (long)(local_1518 - *(int *)((long)local_1220 + 0x24)) * local_1220[1] +
                        (long)(local_1514 - (int)local_1220[5]) * local_1220[2] + local_1220[3];
                *(double *)(*local_1220 + lVar6 * 8) =
                     -(dVar1 * local_e38) *
                     (((((-*(double *)
                            (*local_1268 +
                            ((long)(in_stack_ffffffffffffeae4 - (int)local_1268[4]) +
                             (long)(local_1518 - *(int *)((long)local_1268 + 0x24)) * local_1268[1]
                            + (long)(local_1514 - (int)local_1268[5]) * local_1268[2]) * 8) -
                         *(double *)
                          (*local_1268 +
                          ((long)(local_ad4 - (int)local_1268[4]) +
                           (long)(local_1518 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                          (long)(local_1514 - (int)local_1268[5]) * local_1268[2]) * 8)) +
                         *(double *)
                          (*local_1268 +
                          ((long)(in_stack_ffffffffffffeae4 - (int)local_1268[4]) +
                           (long)(local_af0 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                          (long)(local_1514 - (int)local_1268[5]) * local_1268[2]) * 8) +
                        *(double *)
                         (*local_1268 +
                         ((long)(local_b04 - (int)local_1268[4]) +
                          (long)(local_b08 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                         (long)(local_1514 - (int)local_1268[5]) * local_1268[2]) * 8)) -
                       *(double *)
                        (*local_1268 +
                        ((long)(in_stack_ffffffffffffeae4 - (int)local_1268[4]) +
                         (long)(local_1518 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                        (long)(local_b24 - (int)local_1268[5]) * local_1268[2]) * 8)) -
                      *(double *)
                       (*local_1268 +
                       ((long)(local_b34 - (int)local_1268[4]) +
                        (long)(local_1518 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                       (long)(local_b3c - (int)local_1268[5]) * local_1268[2]) * 8)) +
                      *(double *)
                       (*local_1268 +
                       ((long)(in_stack_ffffffffffffeae4 - (int)local_1268[4]) +
                        (long)(local_b50 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                       (long)(local_b54 - (int)local_1268[5]) * local_1268[2]) * 8) +
                     *(double *)
                      (*local_1268 +
                      ((long)(local_b64 - (int)local_1268[4]) +
                       (long)(local_b68 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                      (long)(local_b6c - (int)local_1268[5]) * local_1268[2]) * 8)) +
                     *(double *)(*local_1220 + lVar6 * 8);
                local_b78 = local_1268;
                local_b80 = local_1518;
                local_b84 = local_1514;
                local_b90 = local_1268;
                local_b94 = in_stack_ffffffffffffeae4 + 1;
                local_b98 = local_1518;
                local_b9c = local_1514;
                local_ba8 = local_1268;
                local_bb0 = local_1518 + 1;
                local_bb4 = local_1514;
                local_bc0 = local_1268;
                local_bc4 = in_stack_ffffffffffffeae4 + 1;
                local_bc8 = local_1518 + 1;
                local_bcc = local_1514;
                local_bd8 = local_1268;
                local_be0 = local_1518;
                local_be4 = local_1514 + 1;
                local_bf0 = local_1268;
                local_bf4 = in_stack_ffffffffffffeae4 + 1;
                local_bf8 = local_1518;
                local_bfc = local_1514 + 1;
                local_c08 = local_1268;
                local_c10 = local_1518 + 1;
                local_c14 = local_1514 + 1;
                local_c20 = local_1268;
                local_c24 = in_stack_ffffffffffffeae4 + 1;
                local_c28 = local_1518 + 1;
                local_c2c = local_1514 + 1;
                local_de8 = local_1220;
                local_df0 = local_1518;
                local_df4 = local_1514;
                local_df8 = 2;
                lVar6 = (long)(in_stack_ffffffffffffeae4 - (int)local_1220[4]) +
                        (long)(local_1518 - *(int *)((long)local_1220 + 0x24)) * local_1220[1] +
                        (long)(local_1514 - (int)local_1220[5]) * local_1220[2] + local_1220[3] * 2;
                *(double *)(*local_1220 + lVar6 * 8) =
                     -(dVar1 * local_e40) *
                     ((((-*(double *)
                           (*local_1268 +
                           ((long)(in_stack_ffffffffffffeae4 - (int)local_1268[4]) +
                            (long)(local_1518 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                           (long)(local_1514 - (int)local_1268[5]) * local_1268[2]) * 8) -
                        *(double *)
                         (*local_1268 +
                         ((long)(local_b94 - (int)local_1268[4]) +
                          (long)(local_1518 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                         (long)(local_1514 - (int)local_1268[5]) * local_1268[2]) * 8)) -
                       *(double *)
                        (*local_1268 +
                        ((long)(in_stack_ffffffffffffeae4 - (int)local_1268[4]) +
                         (long)(local_bb0 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                        (long)(local_1514 - (int)local_1268[5]) * local_1268[2]) * 8)) -
                      *(double *)
                       (*local_1268 +
                       ((long)(local_bc4 - (int)local_1268[4]) +
                        (long)(local_bc8 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                       (long)(local_1514 - (int)local_1268[5]) * local_1268[2]) * 8)) +
                      *(double *)
                       (*local_1268 +
                       ((long)(in_stack_ffffffffffffeae4 - (int)local_1268[4]) +
                        (long)(local_1518 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                       (long)(local_be4 - (int)local_1268[5]) * local_1268[2]) * 8) +
                      *(double *)
                       (*local_1268 +
                       ((long)(local_bf4 - (int)local_1268[4]) +
                        (long)(local_1518 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                       (long)(local_bfc - (int)local_1268[5]) * local_1268[2]) * 8) +
                      *(double *)
                       (*local_1268 +
                       ((long)(in_stack_ffffffffffffeae4 - (int)local_1268[4]) +
                        (long)(local_c10 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                       (long)(local_c14 - (int)local_1268[5]) * local_1268[2]) * 8) +
                     *(double *)
                      (*local_1268 +
                      ((long)(local_c24 - (int)local_1268[4]) +
                       (long)(local_c28 - *(int *)((long)local_1268 + 0x24)) * local_1268[1] +
                      (long)(local_c2c - (int)local_1268[5]) * local_1268[2]) * 8)) +
                     *(double *)(*local_1220 + lVar6 * 8);
                local_e20 = dVar1;
                local_dfc = in_stack_ffffffffffffeae4;
                local_dec = in_stack_ffffffffffffeae4;
                local_dd4 = in_stack_ffffffffffffeae4;
                local_dbc = in_stack_ffffffffffffeae4;
                local_c0c = in_stack_ffffffffffffeae4;
                local_bdc = in_stack_ffffffffffffeae4;
                local_bac = in_stack_ffffffffffffeae4;
                local_b7c = in_stack_ffffffffffffeae4;
                local_b4c = in_stack_ffffffffffffeae4;
                local_b1c = in_stack_ffffffffffffeae4;
                local_aec = in_stack_ffffffffffffeae4;
                local_abc = in_stack_ffffffffffffeae4;
                local_a8c = in_stack_ffffffffffffeae4;
                local_a5c = in_stack_ffffffffffffeae4;
                local_a2c = in_stack_ffffffffffffeae4;
                local_9fc = in_stack_ffffffffffffeae4;
                local_88 = local_e28;
                local_78 = local_e28;
                local_68 = local_e28;
                iVar7 = in_stack_ffffffffffffeae4 + 1;
              }
            }
          }
        }
      }
      MFIter::operator++(&local_11f0);
    }
    MFIter::~MFIter((MFIter *)in_stack_ffffffffffffeab0);
  }
  return;
}

Assistant:

void
MLNodeLaplacian::updateVelocity (const Vector<MultiFab*>& vel, const Vector<MultiFab const*>& sol) const
{
#if (AMREX_SPACEDIM == 2)
    bool is_rz = m_is_rz;
#endif

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev)
    {
        const auto& sigma = m_sigma[amrlev][0][0];
        const auto dxinv = m_geom[amrlev][0].InvCellSizeArray();
#ifdef AMREX_USE_EB
        auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][0].get());
        const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;
        const MultiFab* vfrac = (factory) ? &(factory->getVolFrac()) : nullptr;
        const MultiFab* intg = m_integral[amrlev].get();
#endif
        for (MFIter mfi(*vel[amrlev], TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            Array4<Real> const& varr = vel[amrlev]->array(mfi);
            Array4<Real const> const& solarr = sol[amrlev]->const_array(mfi);
#ifdef AMREX_USE_EB
            bool regular = !factory;
            if (factory)
            {
                Array4<Real const> const& sigmaarr = sigma->const_array(mfi);
                auto type = (*flags)[mfi].getType(bx);
                Array4<Real const> const& vfracarr = vfrac->const_array(mfi);
                Array4<Real const> const& intgarr = intg->const_array(mfi);
                if (type == FabType::covered)
                {
                    AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx, AMREX_SPACEDIM, i, j, k, n,
                    {
                        varr(i,j,k,n) = 0.0;
                    });
                }
                else if (type == FabType::singlevalued)
                {
                    AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                    {
                        mlndlap_mknewu_eb(i,j,k, varr, solarr, sigmaarr, vfracarr, intgarr, dxinv);
                    });
                }
                else
                {
                    regular = true;
                }
            }
            if (regular)
#endif
            {
                if (sigma) {
                    Array4<Real const> const& sigmaarr = sigma->const_array(mfi);
#if (AMREX_SPACEDIM == 2)
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
                    {
                        mlndlap_mknewu(i,j,k,varr,solarr,sigmaarr,dxinv,is_rz);
                    });
#else
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
                    {
                        mlndlap_mknewu(i,j,k,varr,solarr,sigmaarr,dxinv);
                    });
#endif
                } else {
                    Real const_sigma = m_const_sigma;
#if (AMREX_SPACEDIM == 2)
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
                    {
                        mlndlap_mknewu_c(i,j,k,varr,solarr,const_sigma,dxinv,is_rz);
                    });
#else
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
                    {
                        mlndlap_mknewu_c(i,j,k,varr,solarr,const_sigma,dxinv);
                    });
#endif
                }
            }
        }
    }
}